

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined6 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  int iVar61;
  undefined4 uVar62;
  ulong uVar63;
  undefined4 uVar67;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *pRVar64;
  undefined1 (*pauVar65) [16];
  long lVar66;
  RTCIntersectArguments *pRVar68;
  RTCIntersectArguments *pRVar69;
  int iVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  long lVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  short sVar79;
  undefined2 uVar123;
  float fVar80;
  uint uVar81;
  float fVar124;
  float fVar126;
  __m128 a_1;
  uint uVar125;
  uint uVar127;
  uint uVar128;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar129;
  float fVar154;
  float fVar155;
  vfloat4 a;
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar167;
  float fVar168;
  vfloat4 v;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar183;
  float fVar184;
  vfloat4 v_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar203;
  float fVar204;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar230;
  float fVar231;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar240;
  float fVar241;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar253;
  float fVar254;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar255;
  float fVar256;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar257;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar276;
  float fVar281;
  float fVar282;
  undefined1 auVar277 [16];
  undefined1 auVar280 [16];
  float fVar283;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  float fVar292;
  undefined8 uVar293;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  float fVar305;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [16];
  undefined1 auVar315 [16];
  float fVar316;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined8 local_598;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  RTCFilterFunctionNArguments local_508;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined4 local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  float fStack_460;
  float fStack_45c;
  undefined4 local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  Primitive *local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar122;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar197 [16];
  undefined1 auVar201 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar228 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar310 [16];
  
  PVar18 = prim[1];
  uVar63 = (ulong)(byte)PVar18;
  lVar74 = uVar63 * 0x25;
  pPVar8 = prim + lVar74 + 6;
  fVar168 = *(float *)(pPVar8 + 0xc);
  fVar169 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar168;
  fVar183 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar168;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar168;
  fVar156 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar167 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar168 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar62 = *(undefined4 *)(prim + uVar63 * 4 + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar71;
  auVar82._12_2_ = uVar123;
  auVar82._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar158._12_4_ = auVar82._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar71;
  auVar158._10_2_ = uVar123;
  auVar270._10_6_ = auVar158._10_6_;
  auVar270._8_2_ = uVar123;
  auVar270._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar40._4_8_ = auVar270._8_8_;
  auVar40._2_2_ = uVar123;
  auVar40._0_2_ = uVar123;
  fVar306 = (float)((int)sVar79 >> 8);
  fVar312 = (float)(auVar40._0_4_ >> 0x18);
  fVar313 = (float)(auVar270._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 5 + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar71;
  auVar132._12_2_ = uVar123;
  auVar132._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._8_2_ = 0;
  auVar131._0_8_ = uVar71;
  auVar131._10_2_ = uVar123;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = uVar123;
  auVar130._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar41._4_8_ = auVar130._8_8_;
  auVar41._2_2_ = uVar123;
  auVar41._0_2_ = uVar123;
  fVar185 = (float)((int)sVar79 >> 8);
  fVar203 = (float)(auVar41._0_4_ >> 0x18);
  fVar204 = (float)(auVar130._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 6 + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar135._8_4_ = 0;
  auVar135._0_8_ = uVar71;
  auVar135._12_2_ = uVar123;
  auVar135._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar71;
  auVar134._10_2_ = uVar123;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = uVar123;
  auVar133._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar42._4_8_ = auVar133._8_8_;
  auVar42._2_2_ = uVar123;
  auVar42._0_2_ = uVar123;
  fVar232 = (float)((int)sVar79 >> 8);
  fVar240 = (float)(auVar42._0_4_ >> 0x18);
  fVar241 = (float)(auVar133._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 0xf + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar71;
  auVar138._12_2_ = uVar123;
  auVar138._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar71;
  auVar137._10_2_ = uVar123;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = uVar123;
  auVar136._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar43._4_8_ = auVar136._8_8_;
  auVar43._2_2_ = uVar123;
  auVar43._0_2_ = uVar123;
  fVar80 = (float)((int)sVar79 >> 8);
  fVar124 = (float)(auVar43._0_4_ >> 0x18);
  fVar126 = (float)(auVar136._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar71;
  auVar208._12_2_ = uVar123;
  auVar208._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar71;
  auVar207._10_2_ = uVar123;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar123;
  auVar206._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar44._4_8_ = auVar206._8_8_;
  auVar44._2_2_ = uVar123;
  auVar44._0_2_ = uVar123;
  fVar242 = (float)((int)sVar79 >> 8);
  fVar253 = (float)(auVar44._0_4_ >> 0x18);
  fVar254 = (float)(auVar206._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar63 + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar71;
  auVar211._12_2_ = uVar123;
  auVar211._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar71;
  auVar210._10_2_ = uVar123;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar123;
  auVar209._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar45._4_8_ = auVar209._8_8_;
  auVar45._2_2_ = uVar123;
  auVar45._0_2_ = uVar123;
  fVar265 = (float)((int)sVar79 >> 8);
  fVar274 = (float)(auVar45._0_4_ >> 0x18);
  fVar275 = (float)(auVar209._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 0x1a + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar71;
  auVar214._12_2_ = uVar123;
  auVar214._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar71;
  auVar213._10_2_ = uVar123;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar123;
  auVar212._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar46._4_8_ = auVar212._8_8_;
  auVar46._2_2_ = uVar123;
  auVar46._0_2_ = uVar123;
  fVar257 = (float)((int)sVar79 >> 8);
  fVar263 = (float)(auVar46._0_4_ >> 0x18);
  fVar264 = (float)(auVar212._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 0x1b + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar71;
  auVar217._12_2_ = uVar123;
  auVar217._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar71;
  auVar216._10_2_ = uVar123;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar123;
  auVar215._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar47._4_8_ = auVar215._8_8_;
  auVar47._2_2_ = uVar123;
  auVar47._0_2_ = uVar123;
  fVar276 = (float)((int)sVar79 >> 8);
  fVar281 = (float)(auVar47._0_4_ >> 0x18);
  fVar282 = (float)(auVar215._8_4_ >> 0x18);
  uVar62 = *(undefined4 *)(prim + uVar63 * 0x1c + 6);
  uVar122 = (undefined1)((uint)uVar62 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar62 >> 0x10);
  uVar293 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar62));
  uVar122 = (undefined1)((uint)uVar62 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar293 >> 0x20),uVar122),uVar122);
  sVar79 = CONCAT11((char)uVar62,(char)uVar62);
  uVar71 = CONCAT62(uVar39,sVar79);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar71;
  auVar220._12_2_ = uVar123;
  auVar220._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar293 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar71;
  auVar219._10_2_ = uVar123;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar123;
  auVar218._0_8_ = uVar71;
  uVar123 = (undefined2)uVar39;
  auVar48._4_8_ = auVar218._8_8_;
  auVar48._2_2_ = uVar123;
  auVar48._0_2_ = uVar123;
  fVar129 = (float)((int)sVar79 >> 8);
  fVar154 = (float)(auVar48._0_4_ >> 0x18);
  fVar155 = (float)(auVar218._8_4_ >> 0x18);
  fVar292 = fVar156 * fVar306 + fVar167 * fVar185 + fVar168 * fVar232;
  fVar302 = fVar156 * fVar312 + fVar167 * fVar203 + fVar168 * fVar240;
  fVar303 = fVar156 * fVar313 + fVar167 * fVar204 + fVar168 * fVar241;
  fVar304 = fVar156 * (float)(auVar158._12_4_ >> 0x18) +
            fVar167 * (float)(auVar131._12_4_ >> 0x18) + fVar168 * (float)(auVar134._12_4_ >> 0x18);
  fVar283 = fVar156 * fVar80 + fVar167 * fVar242 + fVar168 * fVar265;
  fVar289 = fVar156 * fVar124 + fVar167 * fVar253 + fVar168 * fVar274;
  fVar290 = fVar156 * fVar126 + fVar167 * fVar254 + fVar168 * fVar275;
  fVar291 = fVar156 * (float)(auVar137._12_4_ >> 0x18) +
            fVar167 * (float)(auVar207._12_4_ >> 0x18) + fVar168 * (float)(auVar210._12_4_ >> 0x18);
  fVar205 = fVar156 * fVar257 + fVar167 * fVar276 + fVar168 * fVar129;
  fVar230 = fVar156 * fVar263 + fVar167 * fVar281 + fVar168 * fVar154;
  fVar231 = fVar156 * fVar264 + fVar167 * fVar282 + fVar168 * fVar155;
  fVar168 = fVar156 * (float)(auVar213._12_4_ >> 0x18) +
            fVar167 * (float)(auVar216._12_4_ >> 0x18) + fVar168 * (float)(auVar219._12_4_ >> 0x18);
  fVar307 = fVar306 * fVar169 + fVar185 * fVar183 + fVar232 * fVar184;
  fVar312 = fVar312 * fVar169 + fVar203 * fVar183 + fVar240 * fVar184;
  fVar313 = fVar313 * fVar169 + fVar204 * fVar183 + fVar241 * fVar184;
  fVar314 = (float)(auVar158._12_4_ >> 0x18) * fVar169 +
            (float)(auVar131._12_4_ >> 0x18) * fVar183 + (float)(auVar134._12_4_ >> 0x18) * fVar184;
  fVar265 = fVar80 * fVar169 + fVar242 * fVar183 + fVar265 * fVar184;
  fVar274 = fVar124 * fVar169 + fVar253 * fVar183 + fVar274 * fVar184;
  fVar275 = fVar126 * fVar169 + fVar254 * fVar183 + fVar275 * fVar184;
  fVar306 = (float)(auVar137._12_4_ >> 0x18) * fVar169 +
            (float)(auVar207._12_4_ >> 0x18) * fVar183 + (float)(auVar210._12_4_ >> 0x18) * fVar184;
  fVar257 = fVar169 * fVar257 + fVar183 * fVar276 + fVar184 * fVar129;
  fVar263 = fVar169 * fVar263 + fVar183 * fVar281 + fVar184 * fVar154;
  fVar264 = fVar169 * fVar264 + fVar183 * fVar282 + fVar184 * fVar155;
  fVar276 = fVar169 * (float)(auVar213._12_4_ >> 0x18) +
            fVar183 * (float)(auVar216._12_4_ >> 0x18) + fVar184 * (float)(auVar219._12_4_ >> 0x18);
  uVar81 = (uint)DAT_01f7b6c0;
  uVar125 = DAT_01f7b6c0._4_4_;
  uVar127 = DAT_01f7b6c0._8_4_;
  uVar128 = DAT_01f7b6c0._12_4_;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar292 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar302 & uVar125));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar303 & uVar127));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar304 & uVar128));
  auVar294._0_4_ = (uint)fVar292 & uVar75;
  auVar294._4_4_ = (uint)fVar302 & uVar76;
  auVar294._8_4_ = (uint)fVar303 & uVar77;
  auVar294._12_4_ = (uint)fVar304 & uVar78;
  auVar170._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar170._8_4_ = ~uVar77 & 0x219392ef;
  auVar170._12_4_ = ~uVar78 & 0x219392ef;
  auVar170 = auVar170 | auVar294;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar283 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar289 & uVar125));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar290 & uVar127));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar291 & uVar128));
  auVar284._0_4_ = (uint)fVar283 & uVar75;
  auVar284._4_4_ = (uint)fVar289 & uVar76;
  auVar284._8_4_ = (uint)fVar290 & uVar77;
  auVar284._12_4_ = (uint)fVar291 & uVar78;
  auVar233._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar233._8_4_ = ~uVar77 & 0x219392ef;
  auVar233._12_4_ = ~uVar78 & 0x219392ef;
  auVar233 = auVar233 | auVar284;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar205 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar230 & uVar125));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar231 & uVar127));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar168 & uVar128));
  auVar221._0_4_ = (uint)fVar205 & uVar75;
  auVar221._4_4_ = (uint)fVar230 & uVar76;
  auVar221._8_4_ = (uint)fVar231 & uVar77;
  auVar221._12_4_ = (uint)fVar168 & uVar78;
  auVar243._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar243._8_4_ = ~uVar77 & 0x219392ef;
  auVar243._12_4_ = ~uVar78 & 0x219392ef;
  auVar243 = auVar243 | auVar221;
  auVar82 = rcpps(_DAT_01f7b6c0,auVar170);
  fVar168 = auVar82._0_4_;
  fVar126 = auVar82._4_4_;
  fVar185 = auVar82._8_4_;
  fVar242 = auVar82._12_4_;
  fVar168 = (1.0 - auVar170._0_4_ * fVar168) * fVar168 + fVar168;
  fVar126 = (1.0 - auVar170._4_4_ * fVar126) * fVar126 + fVar126;
  fVar185 = (1.0 - auVar170._8_4_ * fVar185) * fVar185 + fVar185;
  fVar242 = (1.0 - auVar170._12_4_ * fVar242) * fVar242 + fVar242;
  auVar82 = rcpps(auVar82,auVar233);
  fVar80 = auVar82._0_4_;
  fVar129 = auVar82._4_4_;
  fVar203 = auVar82._8_4_;
  fVar253 = auVar82._12_4_;
  fVar80 = (1.0 - auVar233._0_4_ * fVar80) * fVar80 + fVar80;
  fVar129 = (1.0 - auVar233._4_4_ * fVar129) * fVar129 + fVar129;
  fVar203 = (1.0 - auVar233._8_4_ * fVar203) * fVar203 + fVar203;
  fVar253 = (1.0 - auVar233._12_4_ * fVar253) * fVar253 + fVar253;
  auVar82 = rcpps(auVar82,auVar243);
  fVar124 = auVar82._0_4_;
  fVar154 = auVar82._4_4_;
  fVar204 = auVar82._8_4_;
  fVar254 = auVar82._12_4_;
  fVar124 = (1.0 - auVar243._0_4_ * fVar124) * fVar124 + fVar124;
  fVar154 = (1.0 - auVar243._4_4_ * fVar154) * fVar154 + fVar154;
  fVar204 = (1.0 - auVar243._8_4_ * fVar204) * fVar204 + fVar204;
  fVar254 = (1.0 - auVar243._12_4_ * fVar254) * fVar254 + fVar254;
  fVar281 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar74 + 0x16)) *
            *(float *)(prim + lVar74 + 0x1a);
  uVar71 = *(ulong *)(prim + uVar63 * 7 + 6);
  uVar123 = (undefined2)(uVar71 >> 0x30);
  auVar318._8_4_ = 0;
  auVar318._0_8_ = uVar71;
  auVar318._12_2_ = uVar123;
  auVar318._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar71 >> 0x20);
  auVar84._12_4_ = auVar318._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar71;
  auVar84._10_2_ = uVar123;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar123;
  auVar83._0_8_ = uVar71;
  uVar123 = (undefined2)(uVar71 >> 0x10);
  auVar49._4_8_ = auVar83._8_8_;
  auVar49._2_2_ = uVar123;
  auVar49._0_2_ = uVar123;
  fVar155 = (float)(auVar49._0_4_ >> 0x10);
  fVar205 = (float)(auVar83._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar63 * 0xb + 6);
  uVar123 = (undefined2)(uVar9 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar9;
  auVar173._12_2_ = uVar123;
  auVar173._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar9 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar9;
  auVar172._10_2_ = uVar123;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar123;
  auVar171._0_8_ = uVar9;
  uVar123 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar171._8_8_;
  auVar50._2_2_ = uVar123;
  auVar50._0_2_ = uVar123;
  uVar10 = *(ulong *)(prim + uVar63 * 9 + 6);
  uVar123 = (undefined2)(uVar10 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar10;
  auVar87._12_2_ = uVar123;
  auVar87._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar10 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar10;
  auVar86._10_2_ = uVar123;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar123;
  auVar85._0_8_ = uVar10;
  uVar123 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar123;
  auVar51._0_2_ = uVar123;
  fVar156 = (float)(auVar51._0_4_ >> 0x10);
  fVar230 = (float)(auVar85._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar63 * 0xd + 6);
  uVar123 = (undefined2)(uVar11 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar11;
  auVar246._12_2_ = uVar123;
  auVar246._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar11 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar11;
  auVar245._10_2_ = uVar123;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar123;
  auVar244._0_8_ = uVar11;
  uVar123 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar244._8_8_;
  auVar52._2_2_ = uVar123;
  auVar52._0_2_ = uVar123;
  uVar12 = *(ulong *)(prim + uVar63 * 0x12 + 6);
  uVar123 = (undefined2)(uVar12 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar12;
  auVar90._12_2_ = uVar123;
  auVar90._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar12 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar12;
  auVar89._10_2_ = uVar123;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar123;
  auVar88._0_8_ = uVar12;
  uVar123 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar123;
  auVar53._0_2_ = uVar123;
  fVar167 = (float)(auVar53._0_4_ >> 0x10);
  fVar231 = (float)(auVar88._8_4_ >> 0x10);
  uVar72 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar63 * 2 + uVar72 + 6);
  uVar123 = (undefined2)(uVar13 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar13;
  auVar268._12_2_ = uVar123;
  auVar268._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar13 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar13;
  auVar267._10_2_ = uVar123;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar123;
  auVar266._0_8_ = uVar13;
  uVar123 = (undefined2)(uVar13 >> 0x10);
  auVar54._4_8_ = auVar266._8_8_;
  auVar54._2_2_ = uVar123;
  auVar54._0_2_ = uVar123;
  uVar72 = *(ulong *)(prim + uVar72 + 6);
  uVar123 = (undefined2)(uVar72 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar72;
  auVar93._12_2_ = uVar123;
  auVar93._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar72 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar72;
  auVar92._10_2_ = uVar123;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar123;
  auVar91._0_8_ = uVar72;
  uVar123 = (undefined2)(uVar72 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar123;
  auVar55._0_2_ = uVar123;
  fVar169 = (float)(auVar55._0_4_ >> 0x10);
  fVar232 = (float)(auVar91._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar63 * 0x18 + 6);
  uVar123 = (undefined2)(uVar14 >> 0x30);
  auVar279._8_4_ = 0;
  auVar279._0_8_ = uVar14;
  auVar279._12_2_ = uVar123;
  auVar279._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar14 >> 0x20);
  auVar278._12_4_ = auVar279._12_4_;
  auVar278._8_2_ = 0;
  auVar278._0_8_ = uVar14;
  auVar278._10_2_ = uVar123;
  auVar277._10_6_ = auVar278._10_6_;
  auVar277._8_2_ = uVar123;
  auVar277._0_8_ = uVar14;
  uVar123 = (undefined2)(uVar14 >> 0x10);
  auVar56._4_8_ = auVar277._8_8_;
  auVar56._2_2_ = uVar123;
  auVar56._0_2_ = uVar123;
  uVar15 = *(ulong *)(prim + uVar63 * 0x1d + 6);
  uVar123 = (undefined2)(uVar15 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar15;
  auVar96._12_2_ = uVar123;
  auVar96._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar15 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar15;
  auVar95._10_2_ = uVar123;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar123;
  auVar94._0_8_ = uVar15;
  uVar123 = (undefined2)(uVar15 >> 0x10);
  auVar57._4_8_ = auVar94._8_8_;
  auVar57._2_2_ = uVar123;
  auVar57._0_2_ = uVar123;
  fVar183 = (float)(auVar57._0_4_ >> 0x10);
  fVar240 = (float)(auVar94._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar123 = (undefined2)(uVar16 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar16;
  auVar287._12_2_ = uVar123;
  auVar287._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar16 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar16;
  auVar286._10_2_ = uVar123;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar123;
  auVar285._0_8_ = uVar16;
  uVar123 = (undefined2)(uVar16 >> 0x10);
  auVar58._4_8_ = auVar285._8_8_;
  auVar58._2_2_ = uVar123;
  auVar58._0_2_ = uVar123;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar63) + 6);
  uVar123 = (undefined2)(uVar17 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar17;
  auVar99._12_2_ = uVar123;
  auVar99._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar17 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar17;
  auVar98._10_2_ = uVar123;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar123;
  auVar97._0_8_ = uVar17;
  uVar123 = (undefined2)(uVar17 >> 0x10);
  auVar59._4_8_ = auVar97._8_8_;
  auVar59._2_2_ = uVar123;
  auVar59._0_2_ = uVar123;
  fVar184 = (float)(auVar59._0_4_ >> 0x10);
  fVar241 = (float)(auVar97._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar63 * 0x23 + 6);
  uVar123 = (undefined2)(uVar63 >> 0x30);
  auVar297._8_4_ = 0;
  auVar297._0_8_ = uVar63;
  auVar297._12_2_ = uVar123;
  auVar297._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar63 >> 0x20);
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._8_2_ = 0;
  auVar296._0_8_ = uVar63;
  auVar296._10_2_ = uVar123;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._8_2_ = uVar123;
  auVar295._0_8_ = uVar63;
  uVar123 = (undefined2)(uVar63 >> 0x10);
  auVar60._4_8_ = auVar295._8_8_;
  auVar60._2_2_ = uVar123;
  auVar60._0_2_ = uVar123;
  auVar174._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar155) * fVar281 + fVar155) - fVar312) *
                fVar126,((((float)(int)(short)uVar9 - (float)(int)(short)uVar71) * fVar281 +
                         (float)(int)(short)uVar71) - fVar307) * fVar168);
  auVar174._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar205) * fVar281 + fVar205) - fVar313) * fVar185;
  auVar174._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar314) * fVar242;
  auVar247._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar281 +
        (float)(int)(short)uVar10) - fVar307) * fVar168;
  auVar247._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar156) * fVar281 + fVar156) - fVar312) * fVar126;
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar230) * fVar281 + fVar230) - fVar313) * fVar185;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar314) * fVar242;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar167) * fVar281 + fVar167) - fVar274) *
                fVar129,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar281 +
                         (float)(int)(short)uVar12) - fVar265) * fVar80);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar231) * fVar281 + fVar231) - fVar275) * fVar203;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar306) * fVar253;
  auVar280._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar72) * fVar281 +
        (float)(int)(short)uVar72) - fVar265) * fVar80;
  auVar280._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar169) * fVar281 + fVar169) - fVar274) * fVar129;
  auVar280._8_4_ =
       ((((float)(auVar277._8_4_ >> 0x10) - fVar232) * fVar281 + fVar232) - fVar275) * fVar203;
  auVar280._12_4_ =
       ((((float)(auVar278._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar306) * fVar253;
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar183) * fVar281 + fVar183) - fVar263) *
                fVar154,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar281 +
                         (float)(int)(short)uVar15) - fVar257) * fVar124);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar240) * fVar281 + fVar240) - fVar264) * fVar204;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar276) * fVar254;
  auVar298._0_4_ =
       ((((float)(int)(short)uVar63 - (float)(int)(short)uVar17) * fVar281 +
        (float)(int)(short)uVar17) - fVar257) * fVar124;
  auVar298._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar184) * fVar281 + fVar184) - fVar263) * fVar154;
  auVar298._8_4_ =
       ((((float)(auVar295._8_4_ >> 0x10) - fVar241) * fVar281 + fVar241) - fVar264) * fVar204;
  auVar298._12_4_ =
       ((((float)(auVar296._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar276) * fVar254;
  auVar157._8_4_ = auVar174._8_4_;
  auVar157._0_8_ = auVar174._0_8_;
  auVar157._12_4_ = auVar174._12_4_;
  auVar158 = minps(auVar157,auVar247);
  auVar100._8_4_ = auVar269._8_4_;
  auVar100._0_8_ = auVar269._0_8_;
  auVar100._12_4_ = auVar269._12_4_;
  auVar82 = minps(auVar100,auVar280);
  auVar158 = maxps(auVar158,auVar82);
  auVar101._8_4_ = auVar288._8_4_;
  auVar101._0_8_ = auVar288._0_8_;
  auVar101._12_4_ = auVar288._12_4_;
  auVar82 = minps(auVar101,auVar298);
  uVar62 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar139._4_4_ = uVar62;
  auVar139._0_4_ = uVar62;
  auVar139._8_4_ = uVar62;
  auVar139._12_4_ = uVar62;
  auVar82 = maxps(auVar82,auVar139);
  auVar82 = maxps(auVar158,auVar82);
  auVar158 = maxps(auVar174,auVar247);
  auVar270 = maxps(auVar269,auVar280);
  auVar158 = minps(auVar158,auVar270);
  local_1d8 = auVar82._0_4_ * 0.99999964;
  fStack_1d4 = auVar82._4_4_ * 0.99999964;
  fStack_1d0 = auVar82._8_4_ * 0.99999964;
  fStack_1cc = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar288,auVar298);
  fVar168 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar168;
  auVar102._0_4_ = fVar168;
  auVar102._8_4_ = fVar168;
  auVar102._12_4_ = fVar168;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar158,auVar82);
  uVar75 = (uint)(byte)PVar18;
  auVar140._0_4_ = -(uint)(uVar75 != 0 && local_1d8 <= auVar82._0_4_ * 1.0000004);
  auVar140._4_4_ = -(uint)(1 < uVar75 && fStack_1d4 <= auVar82._4_4_ * 1.0000004);
  auVar140._8_4_ = -(uint)(2 < uVar75 && fStack_1d0 <= auVar82._8_4_ * 1.0000004);
  auVar140._12_4_ = -(uint)(3 < uVar75 && fStack_1cc <= auVar82._12_4_ * 1.0000004);
  uVar75 = movmskps(uVar75,auVar140);
  if (uVar75 == 0) {
    return;
  }
  uVar75 = uVar75 & 0xff;
  local_198._0_12_ = mm_lookupmask_ps._240_12_;
  local_198._12_4_ = 0;
  local_2d0 = prim;
LAB_00b3811c:
  lVar74 = 0;
  if (uVar75 != 0) {
    for (; (uVar75 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  uVar76 = *(uint *)(local_2d0 + 2);
  pRVar69 = (RTCIntersectArguments *)(ulong)uVar76;
  uVar77 = *(uint *)(local_2d0 + lVar74 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[(long)pRVar69].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar77 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar168 = pGVar19->fnumTimeSegments;
  fVar80 = (pGVar19->time_range).lower;
  fVar80 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar80) /
           ((pGVar19->time_range).upper - fVar80)) * fVar168;
  _local_478 = ZEXT416((uint)fVar80);
  fVar80 = floorf(fVar80);
  fVar168 = fVar168 + -1.0;
  if (fVar168 <= fVar80) {
    fVar80 = fVar168;
  }
  fVar168 = 0.0;
  if (0.0 <= fVar80) {
    fVar168 = fVar80;
  }
  fVar156 = (float)local_478._0_4_ - fVar168;
  fVar124 = 1.0 - fVar156;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)fVar168 * 0x38;
  lVar74 = *(long *)(_Var20 + lVar73);
  lVar21 = *(long *)(_Var20 + 0x10 + lVar73);
  lVar66 = *(long *)(_Var20 + 0x38 + lVar73);
  lVar73 = *(long *)(_Var20 + 0x48 + lVar73);
  pRVar68 = (RTCIntersectArguments *)(lVar73 * (uVar71 + 3));
  pfVar1 = (float *)(lVar66 + uVar71 * lVar73);
  pfVar2 = (float *)(lVar74 + lVar21 * uVar71);
  local_338 = *pfVar2 * fVar124 + *pfVar1 * fVar156;
  local_158 = pfVar2[1] * fVar124 + pfVar1[1] * fVar156;
  local_218 = pfVar2[2] * fVar124 + pfVar1[2] * fVar156;
  pfVar3 = (float *)(lVar66 + (uVar71 + 1) * lVar73);
  pfVar4 = (float *)(lVar74 + lVar21 * (uVar71 + 1));
  local_238 = *pfVar4 * fVar124 + *pfVar3 * fVar156;
  local_248 = pfVar4[1] * fVar124 + pfVar3[1] * fVar156;
  local_258 = pfVar4[2] * fVar124 + pfVar3[2] * fVar156;
  pfVar5 = (float *)(lVar66 + (uVar71 + 2) * lVar73);
  pfVar6 = (float *)(lVar74 + lVar21 * (uVar71 + 2));
  pfVar7 = (float *)(lVar74 + lVar21 * (uVar71 + 3));
  local_478._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar80 = (ray->super_RayK<1>).org.field_0.m128[1];
  local_288 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_368 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_428 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_4d8 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar168 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_368 * local_368;
  fVar126 = local_428 * local_428;
  fVar129 = local_4d8 * local_4d8;
  fVar168 = fVar168 * fVar168;
  fVar154 = fStack_13c + fVar126 + fVar129;
  auVar222._0_8_ = CONCAT44(fVar126 + fVar126 + fVar168,fVar154);
  auVar222._8_4_ = fVar129 + fVar126 + fVar129;
  auVar222._12_4_ = fVar168 + fVar126 + fVar168;
  auVar186._8_4_ = auVar222._8_4_;
  auVar186._0_8_ = auVar222._0_8_;
  auVar186._12_4_ = auVar222._12_4_;
  auVar82 = rcpss(auVar186,auVar222);
  local_488 = (2.0 - fVar154 * auVar82._0_4_) * auVar82._0_4_ *
              (((local_218 + local_258) * 0.5 - local_288) * local_4d8 +
              ((local_158 + local_248) * 0.5 - fVar80) * local_428 +
              ((local_338 + local_238) * 0.5 - (float)local_478._0_4_) * local_368);
  local_2f8 = ZEXT416((uint)local_488);
  local_478._0_4_ = local_368 * local_488 + (float)local_478._0_4_;
  fVar80 = local_428 * local_488 + fVar80;
  local_288 = local_4d8 * local_488 + local_288;
  local_338 = local_338 - (float)local_478._0_4_;
  local_158 = local_158 - fVar80;
  local_218 = local_218 - local_288;
  fStack_32c = (pfVar2[3] * fVar124 + pfVar1[3] * fVar156) - 0.0;
  fVar154 = (*pfVar6 * fVar124 + *pfVar5 * fVar156) - (float)local_478._0_4_;
  fVar155 = (pfVar6[1] * fVar124 + pfVar5[1] * fVar156) - fVar80;
  local_268 = (pfVar6[2] * fVar124 + pfVar5[2] * fVar156) - local_288;
  fStack_34c = (pfVar6[3] * fVar124 + pfVar5[3] * fVar156) - 0.0;
  pfVar1 = (float *)((long)&pRVar68->flags + lVar66);
  local_238 = local_238 - (float)local_478._0_4_;
  local_248 = local_248 - fVar80;
  local_258 = local_258 - local_288;
  fStack_33c = (pfVar4[3] * fVar124 + pfVar3[3] * fVar156) - 0.0;
  local_478._0_4_ = (fVar156 * *pfVar1 + fVar124 * *pfVar7) - (float)local_478._0_4_;
  fVar80 = (fVar156 * pfVar1[1] + fVar124 * pfVar7[1]) - fVar80;
  local_288 = (fVar156 * pfVar1[2] + fVar124 * pfVar7[2]) - local_288;
  fStack_46c = (fVar156 * pfVar1[3] + fVar124 * pfVar7[3]) - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_214 = local_218;
  fStack_210 = local_218;
  fStack_20c = local_218;
  fStack_334 = local_158;
  fStack_330 = local_218;
  local_228 = fStack_32c;
  fStack_224 = fStack_32c;
  fStack_220 = fStack_32c;
  fStack_21c = fStack_32c;
  fStack_234 = local_238;
  fStack_230 = local_238;
  fStack_22c = local_238;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  local_348 = local_238;
  fStack_344 = local_248;
  fStack_340 = local_258;
  local_168 = fStack_33c;
  fStack_164 = fStack_33c;
  fStack_160 = fStack_33c;
  fStack_15c = fStack_33c;
  local_148 = fStack_13c + fVar129 + fVar126;
  fStack_144 = fStack_13c + fVar129 + fVar126;
  fStack_140 = fStack_13c + fVar129 + fVar126;
  fStack_13c = fStack_13c + fVar129 + fVar126;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  local_358 = fVar154;
  fStack_354 = fVar155;
  fStack_350 = local_268;
  local_278 = fStack_34c;
  fStack_274 = fStack_34c;
  fStack_270 = fStack_34c;
  fStack_26c = fStack_34c;
  fStack_284 = local_288;
  fStack_280 = local_288;
  fStack_27c = local_288;
  local_478._4_4_ = fVar80;
  fStack_470 = local_288;
  local_298 = fStack_46c;
  fStack_294 = fStack_46c;
  fStack_290 = fStack_46c;
  fStack_28c = fStack_46c;
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  fStack_424 = local_428;
  fStack_420 = local_428;
  fStack_41c = local_428;
  local_2b8 = ABS(local_148);
  fStack_2b4 = ABS(fStack_144);
  fStack_2b0 = ABS(fStack_140);
  fStack_2ac = ABS(fStack_13c);
  fVar168 = 1.4013e-45;
  uVar71 = 0;
  local_188 = 0.0;
  fStack_184 = 1.0;
  local_208 = local_338;
  fStack_204 = local_338;
  fStack_200 = local_338;
  fStack_1fc = local_338;
  local_2a8 = (float)local_478._0_4_;
  fStack_2a4 = (float)local_478._0_4_;
  fStack_2a0 = (float)local_478._0_4_;
  fStack_29c = (float)local_478._0_4_;
  fStack_4d4 = local_4d8;
  fStack_4d0 = local_4d8;
  fStack_4cc = local_4d8;
  fStack_484 = local_488;
  fStack_480 = local_488;
  fStack_47c = local_488;
  do {
    uVar62 = SUB84(pRVar68,0);
    iVar70 = (int)uVar71;
    local_3e8._4_4_ = fStack_184 - local_188;
    uStack_180 = 0;
    uStack_17c = 0;
    local_3e8._0_4_ = local_3e8._4_4_;
    fStack_3e0 = (float)local_3e8._4_4_;
    fStack_3dc = (float)local_3e8._4_4_;
    local_3f8 = local_188;
    fStack_3f4 = local_188;
    fStack_3f0 = local_188;
    fStack_3ec = local_188;
    fVar203 = (float)local_3e8._4_4_ * 0.0 + local_188;
    fVar205 = (float)local_3e8._4_4_ * 0.33333334 + local_188;
    fVar231 = (float)local_3e8._4_4_ * 0.6666667 + local_188;
    fVar240 = (float)local_3e8._4_4_ * 1.0 + local_188;
    fVar253 = 1.0 - fVar203;
    fVar306 = 1.0 - fVar205;
    fVar276 = 1.0 - fVar231;
    fVar283 = 1.0 - fVar240;
    fVar124 = fVar203 * 3.0;
    fVar129 = fVar205 * 3.0;
    fVar167 = fVar231 * 3.0;
    fVar183 = fVar240 * 3.0;
    fVar265 = ((fVar253 * 3.0 + -5.0) * fVar253 * fVar253 + 2.0) * 0.5;
    fVar274 = ((fVar306 * 3.0 + -5.0) * fVar306 * fVar306 + 2.0) * 0.5;
    fVar257 = ((fVar276 * 3.0 + -5.0) * fVar276 * fVar276 + 2.0) * 0.5;
    fVar264 = ((fVar283 * 3.0 + -5.0) * fVar283 * fVar283 + 2.0) * 0.5;
    fVar204 = -fVar253 * fVar203 * fVar203 * 0.5;
    fVar230 = -fVar306 * fVar205 * fVar205 * 0.5;
    fVar232 = -fVar276 * fVar231 * fVar231 * 0.5;
    fVar241 = -fVar283 * fVar240 * fVar240 * 0.5;
    fVar281 = (fVar203 * fVar203 * (fVar124 + -5.0) + 2.0) * 0.5;
    fVar282 = (fVar205 * fVar205 * (fVar129 + -5.0) + 2.0) * 0.5;
    fVar289 = (fVar231 * fVar231 * (fVar167 + -5.0) + 2.0) * 0.5;
    fVar290 = (fVar240 * fVar240 * (fVar183 + -5.0) + 2.0) * 0.5;
    fVar185 = (float)local_3e8._4_4_ * 0.11111111;
    fVar291 = -fVar203 * fVar253 * fVar253 * 0.5;
    fVar292 = -fVar205 * fVar306 * fVar306 * 0.5;
    fVar302 = -fVar231 * fVar276 * fVar276 * 0.5;
    fVar303 = -fVar240 * fVar283 * fVar283 * 0.5;
    fVar316 = local_208 * fVar291 + local_238 * fVar281 + fVar154 * fVar265 + local_2a8 * fVar204;
    fVar319 = fStack_204 * fVar292 + fStack_234 * fVar282 + fVar154 * fVar274 + fStack_2a4 * fVar230
    ;
    fVar320 = fStack_200 * fVar302 + fStack_230 * fVar289 + fVar154 * fVar257 + fStack_2a0 * fVar232
    ;
    fVar321 = fStack_1fc * fVar303 + fStack_22c * fVar290 + fVar154 * fVar264 + fStack_29c * fVar241
    ;
    fVar126 = local_158 * fVar291 + local_248 * fVar281 + fVar155 * fVar265 + fVar80 * fVar204;
    fVar156 = fStack_154 * fVar292 + fStack_244 * fVar282 + fVar155 * fVar274 + fVar80 * fVar230;
    fVar169 = fStack_150 * fVar302 + fStack_240 * fVar289 + fVar155 * fVar257 + fVar80 * fVar232;
    fVar184 = fStack_14c * fVar303 + fStack_23c * fVar290 + fVar155 * fVar264 + fVar80 * fVar241;
    fVar242 = local_218 * fVar291 + local_258 * fVar281 + local_268 * fVar265 + local_288 * fVar204;
    fVar254 = fStack_214 * fVar292 +
              fStack_254 * fVar282 + fStack_264 * fVar274 + fStack_284 * fVar230;
    fVar275 = fStack_210 * fVar302 +
              fStack_250 * fVar289 + fStack_260 * fVar257 + fStack_280 * fVar232;
    fVar263 = fStack_20c * fVar303 +
              fStack_24c * fVar290 + fStack_25c * fVar264 + fStack_27c * fVar241;
    fVar291 = fVar291 * local_228 + fVar281 * local_168 + fVar265 * local_278 + fVar204 * local_298;
    fVar292 = fVar292 * fStack_224 +
              fVar282 * fStack_164 + fVar274 * fStack_274 + fVar230 * fStack_294;
    uVar293 = CONCAT44(fVar292,fVar291);
    fVar314 = fVar302 * fStack_220 +
              fVar289 * fStack_160 + fVar257 * fStack_270 + fVar232 * fStack_290;
    fVar305 = fVar303 * fStack_21c +
              fVar290 * fStack_15c + fVar264 * fStack_26c + fVar241 * fStack_28c;
    fVar265 = fVar203 * (fVar253 + fVar253);
    fVar257 = fVar205 * (fVar306 + fVar306);
    fVar281 = fVar231 * (fVar276 + fVar276);
    fVar289 = fVar240 * (fVar283 + fVar283);
    fVar274 = (fVar265 - fVar253 * fVar253) * 0.5;
    fVar264 = (fVar257 - fVar306 * fVar306) * 0.5;
    fVar282 = (fVar281 - fVar276 * fVar276) * 0.5;
    fVar290 = (fVar289 - fVar283 * fVar283) * 0.5;
    fVar204 = (fVar203 * fVar124 + (fVar203 + fVar203) * (fVar124 + -5.0)) * 0.5;
    fVar230 = (fVar205 * fVar129 + (fVar205 + fVar205) * (fVar129 + -5.0)) * 0.5;
    fVar232 = (fVar231 * fVar167 + (fVar231 + fVar231) * (fVar167 + -5.0)) * 0.5;
    fVar241 = (fVar240 * fVar183 + (fVar240 + fVar240) * (fVar183 + -5.0)) * 0.5;
    fVar124 = ((fVar124 + 2.0) * (fVar253 + fVar253) - fVar253 * 3.0 * fVar253) * 0.5;
    fVar129 = ((fVar129 + 2.0) * (fVar306 + fVar306) - fVar306 * 3.0 * fVar306) * 0.5;
    fVar167 = ((fVar167 + 2.0) * (fVar276 + fVar276) - fVar276 * 3.0 * fVar276) * 0.5;
    fVar183 = ((fVar183 + 2.0) * (fVar283 + fVar283) - fVar283 * 3.0 * fVar283) * 0.5;
    fVar203 = (fVar203 * fVar203 - fVar265) * 0.5;
    fVar205 = (fVar205 * fVar205 - fVar257) * 0.5;
    fVar231 = (fVar231 * fVar231 - fVar281) * 0.5;
    fVar240 = (fVar240 * fVar240 - fVar289) * 0.5;
    local_3b8 = (local_208 * fVar274 + local_238 * fVar204 + fVar154 * fVar124 + local_2a8 * fVar203
                ) * fVar185;
    fStack_3b4 = (fStack_204 * fVar264 +
                 fStack_234 * fVar230 + fVar154 * fVar129 + fStack_2a4 * fVar205) * fVar185;
    fStack_3b0 = (fStack_200 * fVar282 +
                 fStack_230 * fVar232 + fVar154 * fVar167 + fStack_2a0 * fVar231) * fVar185;
    fStack_3ac = (fStack_1fc * fVar290 +
                 fStack_22c * fVar241 + fVar154 * fVar183 + fStack_29c * fVar240) * fVar185;
    fVar303 = (local_158 * fVar274 + local_248 * fVar204 + fVar155 * fVar124 + fVar80 * fVar203) *
              fVar185;
    local_398._0_4_ =
         (fStack_154 * fVar264 + fStack_244 * fVar230 + fVar155 * fVar129 + fVar80 * fVar205) *
         fVar185;
    local_398._4_4_ =
         (fStack_150 * fVar282 + fStack_240 * fVar232 + fVar155 * fVar167 + fVar80 * fVar231) *
         fVar185;
    fStack_390 = (fStack_14c * fVar290 + fStack_23c * fVar241 + fVar155 * fVar183 + fVar80 * fVar240
                 ) * fVar185;
    local_388 = (local_218 * fVar274 +
                local_258 * fVar204 + local_268 * fVar124 + local_288 * fVar203) * fVar185;
    fStack_384 = (fStack_214 * fVar264 +
                 fStack_254 * fVar230 + fStack_264 * fVar129 + fStack_284 * fVar205) * fVar185;
    fStack_380 = (fStack_210 * fVar282 +
                 fStack_250 * fVar232 + fStack_260 * fVar167 + fStack_280 * fVar231) * fVar185;
    fStack_37c = (fStack_20c * fVar290 +
                 fStack_24c * fVar241 + fStack_25c * fVar183 + fStack_27c * fVar240) * fVar185;
    fVar129 = fVar185 * (fVar264 * fStack_224 +
                        fVar230 * fStack_164 + fVar129 * fStack_274 + fVar205 * fStack_294);
    fVar167 = fVar185 * (fVar282 * fStack_220 +
                        fVar232 * fStack_160 + fVar167 * fStack_270 + fVar231 * fStack_290);
    fVar183 = fVar185 * (fVar290 * fStack_21c +
                        fVar241 * fStack_15c + fVar183 * fStack_26c + fVar240 * fStack_28c);
    auVar26._4_4_ = fVar156;
    auVar26._0_4_ = fVar126;
    auVar26._8_4_ = fVar169;
    auVar26._12_4_ = fVar184;
    auVar248._0_12_ = auVar26._4_12_;
    auVar248._12_4_ = 0;
    auVar175._4_4_ = fVar314;
    auVar175._0_4_ = fVar292;
    auVar175._8_4_ = fVar305;
    auVar175._12_4_ = 0;
    auVar159._0_4_ =
         fVar291 + fVar185 * (fVar274 * local_228 +
                             fVar204 * local_168 + fVar124 * local_278 + fVar203 * local_298);
    auVar159._4_4_ = fVar292 + fVar129;
    auVar159._8_4_ = fVar314 + fVar167;
    auVar159._12_4_ = fVar305 + fVar183;
    auVar234._0_8_ = CONCAT44(fVar314 - fVar167,fVar292 - fVar129);
    auVar234._8_4_ = fVar305 - fVar183;
    auVar234._12_4_ = 0;
    fVar241 = fVar156 - fVar126;
    fVar265 = fVar169 - fVar156;
    fVar306 = fVar184 - fVar169;
    fVar264 = 0.0 - fVar184;
    local_4a8._0_4_ = fVar254 - fVar242;
    local_4a8._4_4_ = fVar275 - fVar254;
    fStack_4a0 = fVar263 - fVar275;
    fStack_49c = 0.0 - fVar263;
    fVar185 = fVar303 * (float)local_4a8._0_4_ - local_388 * fVar241;
    fVar203 = (float)local_398._0_4_ * (float)local_4a8._4_4_ - fStack_384 * fVar265;
    fVar204 = (float)local_398._4_4_ * fStack_4a0 - fStack_380 * fVar306;
    fVar205 = fStack_390 * fStack_49c - fStack_37c * fVar264;
    local_308._0_4_ = fVar319 - fVar316;
    local_308._4_4_ = fVar320 - fVar319;
    fStack_300 = fVar321 - fVar320;
    fStack_2fc = 0.0 - fVar321;
    fVar253 = local_388 * (float)local_308._0_4_ - local_3b8 * (float)local_4a8._0_4_;
    fVar274 = fStack_384 * (float)local_308._4_4_ - fStack_3b4 * (float)local_4a8._4_4_;
    fVar257 = fStack_380 * fStack_300 - fStack_3b0 * fStack_4a0;
    fVar276 = fStack_37c * fStack_2fc - fStack_3ac * fStack_49c;
    fVar281 = local_3b8 * fVar241 - fVar303 * (float)local_308._0_4_;
    fVar282 = fStack_3b4 * fVar265 - (float)local_398._0_4_ * (float)local_308._4_4_;
    fVar283 = fStack_3b0 * fVar306 - (float)local_398._4_4_ * fStack_300;
    fVar289 = fStack_3ac * fVar264 - fStack_390 * fStack_2fc;
    auVar258._0_4_ = fVar241 * fVar241 + (float)local_4a8._0_4_ * (float)local_4a8._0_4_;
    auVar258._4_4_ = fVar265 * fVar265 + (float)local_4a8._4_4_ * (float)local_4a8._4_4_;
    auVar258._8_4_ = fVar306 * fVar306 + fStack_4a0 * fStack_4a0;
    auVar258._12_4_ = fVar264 * fVar264 + fStack_49c * fStack_49c;
    auVar249._0_4_ = (float)local_308._0_4_ * (float)local_308._0_4_ + auVar258._0_4_;
    auVar249._4_4_ = (float)local_308._4_4_ * (float)local_308._4_4_ + auVar258._4_4_;
    auVar249._8_4_ = fStack_300 * fStack_300 + auVar258._8_4_;
    auVar249._12_4_ = fStack_2fc * fStack_2fc + auVar258._12_4_;
    auVar82 = rcpps(auVar258,auVar249);
    fVar124 = auVar82._0_4_;
    fVar129 = auVar82._4_4_;
    fVar167 = auVar82._8_4_;
    fVar183 = auVar82._12_4_;
    fVar124 = (1.0 - fVar124 * auVar249._0_4_) * fVar124 + fVar124;
    fVar129 = (1.0 - fVar129 * auVar249._4_4_) * fVar129 + fVar129;
    fVar167 = (1.0 - fVar167 * auVar249._8_4_) * fVar167 + fVar167;
    fVar183 = (1.0 - fVar183 * auVar249._12_4_) * fVar183 + fVar183;
    fVar290 = (float)local_4a8._0_4_ * (float)local_398._0_4_ - fVar241 * fStack_384;
    fVar291 = (float)local_4a8._4_4_ * (float)local_398._4_4_ - fVar265 * fStack_380;
    fVar292 = fStack_4a0 * fStack_390 - fVar306 * fStack_37c;
    fVar302 = fStack_49c * 0.0 - fVar264 * 0.0;
    local_3a8 = fStack_384;
    fStack_3a4 = fStack_380;
    fStack_3a0 = fStack_37c;
    fStack_39c = 0.0;
    fVar304 = (float)local_308._0_4_ * fStack_384 - (float)local_4a8._0_4_ * fStack_3b4;
    fVar307 = (float)local_308._4_4_ * fStack_380 - (float)local_4a8._4_4_ * fStack_3b0;
    fVar312 = fStack_300 * fStack_37c - fStack_4a0 * fStack_3ac;
    fVar313 = fStack_2fc * 0.0 - fStack_49c * 0.0;
    fStack_38c = 0.0;
    auVar317._8_4_ = fVar314;
    auVar317._0_8_ = uVar293;
    auVar317._12_4_ = fVar305;
    local_3c8 = fStack_3b4;
    fStack_3c4 = fStack_3b0;
    fStack_3c0 = fStack_3ac;
    fStack_3bc = 0.0;
    fVar230 = fVar241 * fStack_3b4 - (float)local_308._0_4_ * (float)local_398._0_4_;
    fVar231 = fVar265 * fStack_3b0 - (float)local_308._4_4_ * (float)local_398._4_4_;
    fVar232 = fVar306 * fStack_3ac - fStack_300 * fStack_390;
    fVar240 = fVar264 * 0.0 - fStack_2fc * 0.0;
    auVar187._0_4_ = (fVar185 * fVar185 + fVar253 * fVar253 + fVar281 * fVar281) * fVar124;
    auVar187._4_4_ = (fVar203 * fVar203 + fVar274 * fVar274 + fVar282 * fVar282) * fVar129;
    auVar187._8_4_ = (fVar204 * fVar204 + fVar257 * fVar257 + fVar283 * fVar283) * fVar167;
    auVar187._12_4_ = (fVar205 * fVar205 + fVar276 * fVar276 + fVar289 * fVar289) * fVar183;
    auVar271._0_4_ = (fVar290 * fVar290 + fVar304 * fVar304 + fVar230 * fVar230) * fVar124;
    auVar271._4_4_ = (fVar291 * fVar291 + fVar307 * fVar307 + fVar231 * fVar231) * fVar129;
    auVar271._8_4_ = (fVar292 * fVar292 + fVar312 * fVar312 + fVar232 * fVar232) * fVar167;
    auVar271._12_4_ = (fVar302 * fVar302 + fVar313 * fVar313 + fVar240 * fVar240) * fVar183;
    auVar158 = maxps(auVar187,auVar271);
    auVar141._8_4_ = fVar314;
    auVar141._0_8_ = uVar293;
    auVar141._12_4_ = fVar305;
    auVar82 = maxps(auVar141,auVar159);
    auVar259._8_4_ = auVar234._8_4_;
    auVar259._0_8_ = auVar234._0_8_;
    auVar259._12_4_ = 0;
    auVar270 = maxps(auVar259,auVar175);
    auVar82 = maxps(auVar82,auVar270);
    auVar318 = minps(auVar317,auVar159);
    auVar270 = minps(auVar234,auVar175);
    auVar318 = minps(auVar318,auVar270);
    auVar158 = sqrtps(auVar159,auVar158);
    auVar270 = rsqrtps(auVar158,auVar249);
    fVar124 = auVar270._0_4_;
    fVar129 = auVar270._4_4_;
    fVar167 = auVar270._8_4_;
    fVar183 = auVar270._12_4_;
    fVar124 = fVar124 * 1.5 - fVar124 * fVar124 * auVar249._0_4_ * 0.5 * fVar124;
    fVar129 = fVar129 * 1.5 - fVar129 * fVar129 * auVar249._4_4_ * 0.5 * fVar129;
    fVar167 = fVar167 * 1.5 - fVar167 * fVar167 * auVar249._8_4_ * 0.5 * fVar167;
    fVar183 = fVar183 * 1.5 - fVar183 * fVar183 * auVar249._12_4_ * 0.5 * fVar183;
    fVar253 = 0.0 - fVar126;
    fVar274 = 0.0 - fVar156;
    fVar257 = 0.0 - fVar169;
    fVar276 = 0.0 - fVar184;
    local_3d8 = 0.0 - fVar242;
    fStack_3d4 = 0.0 - fVar254;
    fStack_3d0 = 0.0 - fVar275;
    fStack_3cc = 0.0 - fVar263;
    fVar290 = 0.0 - fVar316;
    fVar291 = 0.0 - fVar319;
    fVar292 = 0.0 - fVar320;
    fVar302 = 0.0 - fVar321;
    auVar29._4_4_ = fStack_364;
    auVar29._0_4_ = local_368;
    auVar29._8_4_ = fStack_360;
    auVar29._12_4_ = fStack_35c;
    local_318._0_4_ =
         local_368 * (float)local_308._0_4_ * fVar124 +
         local_428 * fVar241 * fVar124 + local_4d8 * (float)local_4a8._0_4_ * fVar124;
    local_318._4_4_ =
         fStack_364 * (float)local_308._4_4_ * fVar129 +
         fStack_424 * fVar265 * fVar129 + fStack_4d4 * (float)local_4a8._4_4_ * fVar129;
    fStack_310 = fStack_360 * fStack_300 * fVar167 +
                 fStack_420 * fVar306 * fVar167 + fStack_4d0 * fStack_4a0 * fVar167;
    fStack_30c = fStack_35c * fStack_2fc * fVar183 +
                 fStack_41c * fVar264 * fVar183 + fStack_4cc * fStack_49c * fVar183;
    fVar230 = (float)local_308._0_4_ * fVar124 * fVar290 +
              fVar241 * fVar124 * fVar253 + (float)local_4a8._0_4_ * fVar124 * local_3d8;
    fVar231 = (float)local_308._4_4_ * fVar129 * fVar291 +
              fVar265 * fVar129 * fVar274 + (float)local_4a8._4_4_ * fVar129 * fStack_3d4;
    fVar232 = fStack_300 * fVar167 * fVar292 +
              fVar306 * fVar167 * fVar257 + fStack_4a0 * fVar167 * fStack_3d0;
    fVar240 = fStack_2fc * fVar183 * fVar302 +
              fVar264 * fVar183 * fVar276 + fStack_49c * fVar183 * fStack_3cc;
    local_178 = (local_368 * fVar290 + local_428 * fVar253 + local_4d8 * local_3d8) -
                (float)local_318._0_4_ * fVar230;
    fStack_174 = (fStack_364 * fVar291 + fStack_424 * fVar274 + fStack_4d4 * fStack_3d4) -
                 (float)local_318._4_4_ * fVar231;
    fStack_170 = (fStack_360 * fVar292 + fStack_420 * fVar257 + fStack_4d0 * fStack_3d0) -
                 fStack_310 * fVar232;
    fStack_16c = (fStack_35c * fVar302 + fStack_41c * fVar276 + fStack_4cc * fStack_3cc) -
                 fStack_30c * fVar240;
    fVar281 = (fVar290 * fVar290 + fVar253 * fVar253 + local_3d8 * local_3d8) - fVar230 * fVar230;
    fVar282 = (fVar291 * fVar291 + fVar274 * fVar274 + fStack_3d4 * fStack_3d4) - fVar231 * fVar231;
    fVar283 = (fVar292 * fVar292 + fVar257 * fVar257 + fStack_3d0 * fStack_3d0) - fVar232 * fVar232;
    fVar289 = (fVar302 * fVar302 + fVar276 * fVar276 + fStack_3cc * fStack_3cc) - fVar240 * fVar240;
    fVar185 = (auVar82._0_4_ + auVar158._0_4_) * 1.0000002;
    fVar203 = (auVar82._4_4_ + auVar158._4_4_) * 1.0000002;
    fVar204 = (auVar82._8_4_ + auVar158._8_4_) * 1.0000002;
    fVar205 = (auVar82._12_4_ + auVar158._12_4_) * 1.0000002;
    auVar235._0_4_ = fVar281 - fVar185 * fVar185;
    auVar235._4_4_ = fVar282 - fVar203 * fVar203;
    auVar235._8_4_ = fVar283 - fVar204 * fVar204;
    auVar235._12_4_ = fVar289 - fVar205 * fVar205;
    local_328 = (float)local_318._0_4_ * (float)local_318._0_4_;
    fStack_324 = (float)local_318._4_4_ * (float)local_318._4_4_;
    fStack_320 = fStack_310 * fStack_310;
    fStack_31c = fStack_30c * fStack_30c;
    fVar185 = local_148 - local_328;
    fVar203 = fStack_144 - fStack_324;
    fVar204 = fStack_140 - fStack_320;
    fVar205 = fStack_13c - fStack_31c;
    local_178 = local_178 + local_178;
    fStack_174 = fStack_174 + fStack_174;
    fStack_170 = fStack_170 + fStack_170;
    fStack_16c = fStack_16c + fStack_16c;
    local_418 = local_178 * local_178;
    fStack_414 = fStack_174 * fStack_174;
    fStack_410 = fStack_170 * fStack_170;
    fStack_40c = fStack_16c * fStack_16c;
    auVar142._0_4_ = local_418 - fVar185 * 4.0 * auVar235._0_4_;
    auVar142._4_4_ = fStack_414 - fVar203 * 4.0 * auVar235._4_4_;
    auVar142._8_4_ = fStack_410 - fVar204 * 4.0 * auVar235._8_4_;
    auVar142._12_4_ = fStack_40c - fVar205 * 4.0 * auVar235._12_4_;
    local_498._4_4_ = (auVar318._4_4_ - auVar158._4_4_) * 0.99999976;
    local_498._0_4_ = (auVar318._0_4_ - auVar158._0_4_) * 0.99999976;
    fStack_490 = (auVar318._8_4_ - auVar158._8_4_) * 0.99999976;
    fStack_48c = (auVar318._12_4_ - auVar158._12_4_) * 0.99999976;
    auVar160._4_4_ = -(uint)(0.0 <= auVar142._4_4_);
    auVar160._0_4_ = -(uint)(0.0 <= auVar142._0_4_);
    auVar160._8_4_ = -(uint)(0.0 <= auVar142._8_4_);
    auVar160._12_4_ = -(uint)(0.0 <= auVar142._12_4_);
    uVar67 = (undefined4)((ulong)lVar66 >> 0x20);
    iVar61 = movmskps((int)lVar66,auVar160);
    if (iVar61 == 0) {
      iVar61 = 0;
      auVar236 = _DAT_01f7aa00;
      auVar250 = _DAT_01f7a9f0;
    }
    else {
      auVar158 = sqrtps(auVar29,auVar142);
      bVar22 = 0.0 <= auVar142._0_4_;
      uVar78 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar142._4_4_;
      uVar81 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar142._8_4_;
      uVar125 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar142._12_4_;
      uVar127 = -(uint)bVar25;
      auVar188._0_4_ = fVar185 + fVar185;
      auVar188._4_4_ = fVar203 + fVar203;
      auVar188._8_4_ = fVar204 + fVar204;
      auVar188._12_4_ = fVar205 + fVar205;
      auVar82 = rcpps(auVar235,auVar188);
      fVar314 = auVar82._0_4_;
      fVar305 = auVar82._4_4_;
      fVar255 = auVar82._8_4_;
      fVar256 = auVar82._12_4_;
      fVar314 = (1.0 - auVar188._0_4_ * fVar314) * fVar314 + fVar314;
      fVar305 = (1.0 - auVar188._4_4_ * fVar305) * fVar305 + fVar305;
      fVar255 = (1.0 - auVar188._8_4_ * fVar255) * fVar255 + fVar255;
      fVar256 = (1.0 - auVar188._12_4_ * fVar256) * fVar256 + fVar256;
      fVar304 = (-local_178 - auVar158._0_4_) * fVar314;
      fVar307 = (-fStack_174 - auVar158._4_4_) * fVar305;
      fVar312 = (-fStack_170 - auVar158._8_4_) * fVar255;
      fVar313 = (-fStack_16c - auVar158._12_4_) * fVar256;
      fVar314 = (auVar158._0_4_ - local_178) * fVar314;
      fVar305 = (auVar158._4_4_ - fStack_174) * fVar305;
      fVar255 = (auVar158._8_4_ - fStack_170) * fVar255;
      fVar256 = (auVar158._12_4_ - fStack_16c) * fVar256;
      local_1a8 = ((float)local_318._0_4_ * fVar304 + fVar230) * fVar124;
      fStack_1a4 = ((float)local_318._4_4_ * fVar307 + fVar231) * fVar129;
      fStack_1a0 = (fStack_310 * fVar312 + fVar232) * fVar167;
      fStack_19c = (fStack_30c * fVar313 + fVar240) * fVar183;
      local_438._4_4_ = ((float)local_318._4_4_ * fVar305 + fVar231) * fVar129;
      local_438._0_4_ = ((float)local_318._0_4_ * fVar314 + fVar230) * fVar124;
      fStack_430 = (fStack_310 * fVar255 + fVar232) * fVar167;
      fStack_42c = (fStack_30c * fVar256 + fVar240) * fVar183;
      auVar189._0_4_ = (uint)fVar304 & uVar78;
      auVar189._4_4_ = (uint)fVar307 & uVar81;
      auVar189._8_4_ = (uint)fVar312 & uVar125;
      auVar189._12_4_ = (uint)fVar313 & uVar127;
      auVar250._0_8_ = CONCAT44(~uVar81,~uVar78) & 0x7f8000007f800000;
      auVar250._8_4_ = ~uVar125 & 0x7f800000;
      auVar250._12_4_ = ~uVar127 & 0x7f800000;
      auVar250 = auVar250 | auVar189;
      auVar299._0_4_ = (uint)fVar314 & uVar78;
      auVar299._4_4_ = (uint)fVar305 & uVar81;
      auVar299._8_4_ = (uint)fVar255 & uVar125;
      auVar299._12_4_ = (uint)fVar256 & uVar127;
      auVar236._0_8_ = CONCAT44(~uVar81,~uVar78) & 0xff800000ff800000;
      auVar236._8_4_ = ~uVar125 & 0xff800000;
      auVar236._12_4_ = ~uVar127 & 0xff800000;
      auVar236 = auVar236 | auVar299;
      auVar260._0_8_ = CONCAT44(fStack_324,local_328) & 0x7fffffff7fffffff;
      auVar260._8_4_ = ABS(fStack_320);
      auVar260._12_4_ = ABS(fStack_31c);
      auVar36._4_4_ = fStack_2b4;
      auVar36._0_4_ = local_2b8;
      auVar36._8_4_ = fStack_2b0;
      auVar36._12_4_ = fStack_2ac;
      auVar82 = maxps(auVar36,auVar260);
      fVar304 = auVar82._0_4_ * 1.9073486e-06;
      fVar307 = auVar82._4_4_ * 1.9073486e-06;
      fVar312 = auVar82._8_4_ * 1.9073486e-06;
      fVar313 = auVar82._12_4_ * 1.9073486e-06;
      auVar300._0_4_ = -(uint)(ABS(fVar185) < fVar304 && bVar22);
      auVar300._4_4_ = -(uint)(ABS(fVar203) < fVar307 && bVar23);
      auVar300._8_4_ = -(uint)(ABS(fVar204) < fVar312 && bVar24);
      auVar300._12_4_ = -(uint)(ABS(fVar205) < fVar313 && bVar25);
      iVar61 = movmskps(iVar61,auVar300);
      if (iVar61 != 0) {
        uVar78 = -(uint)(auVar235._0_4_ <= 0.0);
        uVar81 = -(uint)(auVar235._4_4_ <= 0.0);
        uVar125 = -(uint)(auVar235._8_4_ <= 0.0);
        uVar127 = -(uint)(auVar235._12_4_ <= 0.0);
        auVar190._0_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar300._0_4_;
        auVar190._4_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar300._4_4_;
        auVar190._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar300._8_4_;
        auVar190._12_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar300._12_4_;
        auVar103._0_4_ = ~auVar300._0_4_ & auVar250._0_4_;
        auVar103._4_4_ = ~auVar300._4_4_ & auVar250._4_4_;
        auVar103._8_4_ = ~auVar300._8_4_ & auVar250._8_4_;
        auVar103._12_4_ = ~auVar300._12_4_ & auVar250._12_4_;
        auVar191._0_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar300._0_4_;
        auVar191._4_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar300._4_4_;
        auVar191._8_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar300._8_4_;
        auVar191._12_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar300._12_4_;
        auVar301._0_4_ = ~auVar300._0_4_ & auVar236._0_4_;
        auVar301._4_4_ = ~auVar300._4_4_ & auVar236._4_4_;
        auVar301._8_4_ = ~auVar300._8_4_ & auVar236._8_4_;
        auVar301._12_4_ = ~auVar300._12_4_ & auVar236._12_4_;
        auVar160._4_4_ = -(uint)((fVar307 <= ABS(fVar203) || auVar235._4_4_ <= 0.0) && bVar23);
        auVar160._0_4_ = -(uint)((fVar304 <= ABS(fVar185) || auVar235._0_4_ <= 0.0) && bVar22);
        auVar160._8_4_ = -(uint)((fVar312 <= ABS(fVar204) || auVar235._8_4_ <= 0.0) && bVar24);
        auVar160._12_4_ = -(uint)((fVar313 <= ABS(fVar205) || auVar235._12_4_ <= 0.0) && bVar25);
        auVar236 = auVar301 | auVar191;
        auVar250 = auVar103 | auVar190;
      }
    }
    auVar161._0_4_ = (auVar160._0_4_ << 0x1f) >> 0x1f;
    auVar161._4_4_ = (auVar160._4_4_ << 0x1f) >> 0x1f;
    auVar161._8_4_ = (auVar160._8_4_ << 0x1f) >> 0x1f;
    auVar161._12_4_ = (auVar160._12_4_ << 0x1f) >> 0x1f;
    auVar161 = auVar161 & local_198;
    iVar61 = movmskps(iVar61,auVar161);
    if (iVar61 != 0) {
      local_1c8 = fVar230;
      fStack_1c4 = fVar231;
      fStack_1c0 = fVar232;
      fStack_1bc = fVar240;
      local_1b8 = fVar124;
      fStack_1b4 = fVar129;
      fStack_1b0 = fVar167;
      fStack_1ac = fVar183;
      local_2c8 = fVar185;
      fStack_2c4 = fVar203;
      fStack_2c0 = fVar204;
      fStack_2bc = fVar205;
      auVar315._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2f8._0_4_;
      auVar315._4_4_ = auVar315._0_4_;
      auVar315._8_4_ = auVar315._0_4_;
      auVar315._12_4_ = auVar315._0_4_;
      auVar270 = maxps(auVar315,auVar250);
      auVar251._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2f8._0_4_;
      auVar251._4_4_ = auVar251._0_4_;
      auVar251._8_4_ = auVar251._0_4_;
      auVar251._12_4_ = auVar251._0_4_;
      auVar158 = minps(auVar251,auVar236);
      auVar104._0_4_ = fVar303 * local_428 + local_388 * local_4d8;
      auVar104._4_4_ = (float)local_398._0_4_ * fStack_424 + fStack_384 * fStack_4d4;
      auVar104._8_4_ = (float)local_398._4_4_ * fStack_420 + fStack_380 * fStack_4d0;
      auVar104._12_4_ = fStack_390 * fStack_41c + fStack_37c * fStack_4cc;
      auVar223._0_4_ = local_3b8 * local_368 + auVar104._0_4_;
      auVar223._4_4_ = fStack_3b4 * fStack_364 + auVar104._4_4_;
      auVar223._8_4_ = fStack_3b0 * fStack_360 + auVar104._8_4_;
      auVar223._12_4_ = fStack_3ac * fStack_35c + auVar104._12_4_;
      auVar82 = rcpps(auVar104,auVar223);
      fVar304 = auVar82._0_4_;
      fVar307 = auVar82._4_4_;
      fVar312 = auVar82._8_4_;
      fVar313 = auVar82._12_4_;
      fVar253 = ((1.0 - auVar223._0_4_ * fVar304) * fVar304 + fVar304) *
                -(fVar290 * local_3b8 + fVar253 * fVar303 + local_3d8 * local_388);
      fVar274 = ((1.0 - auVar223._4_4_ * fVar307) * fVar307 + fVar307) *
                -(fVar291 * fStack_3b4 + fVar274 * (float)local_398._0_4_ + fStack_3d4 * fStack_384)
      ;
      fVar257 = ((1.0 - auVar223._8_4_ * fVar312) * fVar312 + fVar312) *
                -(fVar292 * fStack_3b0 + fVar257 * (float)local_398._4_4_ + fStack_3d0 * fStack_380)
      ;
      fVar276 = ((1.0 - auVar223._12_4_ * fVar313) * fVar313 + fVar313) *
                -(fVar302 * fStack_3ac + fVar276 * fStack_390 + fStack_3cc * fStack_37c);
      uVar78 = -(uint)(auVar223._0_4_ < 0.0 || ABS(auVar223._0_4_) < 1e-18);
      uVar81 = -(uint)(auVar223._4_4_ < 0.0 || ABS(auVar223._4_4_) < 1e-18);
      uVar125 = -(uint)(auVar223._8_4_ < 0.0 || ABS(auVar223._8_4_) < 1e-18);
      uVar127 = -(uint)(auVar223._12_4_ < 0.0 || ABS(auVar223._12_4_) < 1e-18);
      auVar192._0_8_ = CONCAT44(uVar81,uVar78) & 0xff800000ff800000;
      auVar192._8_4_ = uVar125 & 0xff800000;
      auVar192._12_4_ = uVar127 & 0xff800000;
      auVar105._0_4_ = ~uVar78 & (uint)fVar253;
      auVar105._4_4_ = ~uVar81 & (uint)fVar274;
      auVar105._8_4_ = ~uVar125 & (uint)fVar257;
      auVar105._12_4_ = ~uVar127 & (uint)fVar276;
      auVar270 = maxps(auVar270,auVar105 | auVar192);
      uVar78 = -(uint)(0.0 < auVar223._0_4_ || ABS(auVar223._0_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar223._4_4_ || ABS(auVar223._4_4_) < 1e-18);
      uVar125 = -(uint)(0.0 < auVar223._8_4_ || ABS(auVar223._8_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar223._12_4_ || ABS(auVar223._12_4_) < 1e-18);
      auVar106._0_8_ = CONCAT44(uVar81,uVar78) & 0x7f8000007f800000;
      auVar106._8_4_ = uVar125 & 0x7f800000;
      auVar106._12_4_ = uVar127 & 0x7f800000;
      auVar224._0_4_ = ~uVar78 & (uint)fVar253;
      auVar224._4_4_ = ~uVar81 & (uint)fVar274;
      auVar224._8_4_ = ~uVar125 & (uint)fVar257;
      auVar224._12_4_ = ~uVar127 & (uint)fVar276;
      auVar158 = minps(auVar158,auVar224 | auVar106);
      auVar143._0_4_ = (0.0 - fVar156) * -(float)local_398._0_4_ + (0.0 - fVar254) * -fStack_384;
      auVar143._4_4_ = (0.0 - fVar169) * -(float)local_398._4_4_ + (0.0 - fVar275) * -fStack_380;
      auVar143._8_4_ = (0.0 - fVar184) * -fStack_390 + (0.0 - fVar263) * -fStack_37c;
      auVar143._12_4_ = 0x80000000;
      auVar308._0_4_ =
           -fStack_3b4 * local_368 + -(float)local_398._0_4_ * local_428 + -fStack_384 * local_4d8;
      auVar308._4_4_ =
           -fStack_3b0 * fStack_364 +
           -(float)local_398._4_4_ * fStack_424 + -fStack_380 * fStack_4d4;
      auVar308._8_4_ =
           -fStack_3ac * fStack_360 + -fStack_390 * fStack_420 + -fStack_37c * fStack_4d0;
      auVar308._12_4_ = fStack_35c * -0.0 + fStack_41c * -0.0 + fStack_4cc * -0.0;
      auVar82 = rcpps(auVar143,auVar308);
      fVar253 = auVar82._0_4_;
      fVar274 = auVar82._4_4_;
      fVar257 = auVar82._8_4_;
      fVar276 = auVar82._12_4_;
      fVar253 = (((float)DAT_01f7ba10 - auVar308._0_4_ * fVar253) * fVar253 + fVar253) *
                -((0.0 - fVar319) * -fStack_3b4 + auVar143._0_4_);
      fVar274 = ((DAT_01f7ba10._4_4_ - auVar308._4_4_ * fVar274) * fVar274 + fVar274) *
                -((0.0 - fVar320) * -fStack_3b0 + auVar143._4_4_);
      fVar257 = ((DAT_01f7ba10._8_4_ - auVar308._8_4_ * fVar257) * fVar257 + fVar257) *
                -((0.0 - fVar321) * -fStack_3ac + auVar143._8_4_);
      fVar276 = ((DAT_01f7ba10._12_4_ - auVar308._12_4_ * fVar276) * fVar276 + fVar276) * 0.0;
      uVar78 = -(uint)(auVar308._0_4_ < 0.0 || ABS(auVar308._0_4_) < 1e-18);
      uVar81 = -(uint)(auVar308._4_4_ < 0.0 || ABS(auVar308._4_4_) < 1e-18);
      uVar125 = -(uint)(auVar308._8_4_ < 0.0 || ABS(auVar308._8_4_) < 1e-18);
      uVar127 = -(uint)(auVar308._12_4_ < 0.0 || ABS(auVar308._12_4_) < 1e-18);
      auVar144._0_8_ = CONCAT44(uVar81,uVar78) & 0xff800000ff800000;
      auVar144._8_4_ = uVar125 & 0xff800000;
      auVar144._12_4_ = uVar127 & 0xff800000;
      auVar107._0_4_ = ~uVar78 & (uint)fVar253;
      auVar107._4_4_ = ~uVar81 & (uint)fVar274;
      auVar107._8_4_ = ~uVar125 & (uint)fVar257;
      auVar107._12_4_ = ~uVar127 & (uint)fVar276;
      _local_408 = maxps(auVar270,auVar107 | auVar144);
      uVar78 = -(uint)(0.0 < auVar308._0_4_ || ABS(auVar308._0_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar308._4_4_ || ABS(auVar308._4_4_) < 1e-18);
      uVar125 = -(uint)(0.0 < auVar308._8_4_ || ABS(auVar308._8_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar308._12_4_ || ABS(auVar308._12_4_) < 1e-18);
      auVar261._0_8_ = CONCAT44(uVar81,uVar78) & 0x7f8000007f800000;
      auVar261._8_4_ = uVar125 & 0x7f800000;
      auVar261._12_4_ = uVar127 & 0x7f800000;
      auVar309._0_4_ = ~uVar78 & (uint)fVar253;
      auVar309._4_4_ = ~uVar81 & (uint)fVar274;
      auVar309._8_4_ = ~uVar125 & (uint)fVar257;
      auVar309._12_4_ = ~uVar127 & (uint)fVar276;
      auVar82 = minps(auVar158,auVar309 | auVar261);
      fVar253 = local_408._0_4_;
      fVar274 = local_408._4_4_;
      fVar257 = local_408._8_4_;
      fVar276 = local_408._12_4_;
      local_4c8._0_4_ = -(uint)(fVar253 <= auVar82._0_4_) & auVar161._0_4_;
      local_4c8._4_4_ = -(uint)(fVar274 <= auVar82._4_4_) & auVar161._4_4_;
      fStack_4c0 = (float)(-(uint)(fVar257 <= auVar82._8_4_) & auVar161._8_4_);
      fStack_4bc = (float)(-(uint)(fVar276 <= auVar82._12_4_) & auVar161._12_4_);
      iVar61 = movmskps(iVar61,_local_4c8);
      if (iVar61 != 0) {
        auVar270 = maxps(ZEXT816(0),_local_498);
        auVar38._4_4_ = fStack_1a4;
        auVar38._0_4_ = local_1a8;
        auVar38._8_4_ = fStack_1a0;
        auVar38._12_4_ = fStack_19c;
        auVar158 = minps(auVar38,_DAT_01f7ba10);
        auVar193._0_12_ = ZEXT812(0);
        auVar193._12_4_ = 0.0;
        auVar318 = maxps(auVar158,auVar193);
        auVar158 = minps(_local_438,_DAT_01f7ba10);
        auVar158 = maxps(auVar158,auVar193);
        local_108[0] = (auVar318._0_4_ + 0.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_108[1] = (auVar318._4_4_ + 1.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_108[2] = (auVar318._8_4_ + 2.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_108[3] = (auVar318._12_4_ + 3.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_118[0] = (auVar158._0_4_ + 0.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_118[1] = (auVar158._4_4_ + 1.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_118[2] = (auVar158._8_4_ + 2.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        local_118[3] = (auVar158._12_4_ + 3.0) * 0.25 * (float)local_3e8._4_4_ + local_188;
        auVar162._0_4_ = fVar281 - auVar270._0_4_ * auVar270._0_4_;
        auVar162._4_4_ = fVar282 - auVar270._4_4_ * auVar270._4_4_;
        auVar162._8_4_ = fVar283 - auVar270._8_4_ * auVar270._8_4_;
        auVar162._12_4_ = fVar289 - auVar270._12_4_ * auVar270._12_4_;
        auVar237._0_4_ = local_418 - fVar185 * 4.0 * auVar162._0_4_;
        auVar237._4_4_ = fStack_414 - fVar203 * 4.0 * auVar162._4_4_;
        auVar237._8_4_ = fStack_410 - fVar204 * 4.0 * auVar162._8_4_;
        auVar237._12_4_ = fStack_40c - fVar205 * 4.0 * auVar162._12_4_;
        local_438._4_4_ = -(uint)(0.0 <= auVar237._4_4_);
        local_438._0_4_ = -(uint)(0.0 <= auVar237._0_4_);
        fStack_430 = (float)-(uint)(0.0 <= auVar237._8_4_);
        fStack_42c = (float)-(uint)(0.0 <= auVar237._12_4_);
        iVar61 = movmskps(iVar61,_local_438);
        if (iVar61 == 0) {
          _local_558 = ZEXT816(0);
          fVar126 = 0.0;
          fVar156 = 0.0;
          fVar169 = 0.0;
          fVar184 = 0.0;
          _local_538 = ZEXT816(0);
          _local_548 = ZEXT816(0);
          _local_498 = ZEXT816(0);
          iVar61 = 0;
          auVar163 = _DAT_01f7aa00;
          auVar252 = _DAT_01f7a9f0;
        }
        else {
          auVar270 = sqrtps(_local_3e8,auVar237);
          auVar145._0_4_ = fVar185 + fVar185;
          auVar145._4_4_ = fVar203 + fVar203;
          auVar145._8_4_ = fVar204 + fVar204;
          auVar145._12_4_ = fVar205 + fVar205;
          auVar158 = rcpps(auVar162,auVar145);
          fVar281 = auVar158._0_4_;
          fVar282 = auVar158._4_4_;
          fVar283 = auVar158._8_4_;
          fVar289 = auVar158._12_4_;
          fVar281 = ((float)DAT_01f7ba10 - auVar145._0_4_ * fVar281) * fVar281 + fVar281;
          fVar282 = (DAT_01f7ba10._4_4_ - auVar145._4_4_ * fVar282) * fVar282 + fVar282;
          fVar283 = (DAT_01f7ba10._8_4_ - auVar145._8_4_ * fVar283) * fVar283 + fVar283;
          fVar289 = (DAT_01f7ba10._12_4_ - auVar145._12_4_ * fVar289) * fVar289 + fVar289;
          fVar303 = (-local_178 - auVar270._0_4_) * fVar281;
          fVar304 = (-fStack_174 - auVar270._4_4_) * fVar282;
          fVar307 = (-fStack_170 - auVar270._8_4_) * fVar283;
          fVar312 = (-fStack_16c - auVar270._12_4_) * fVar289;
          fVar281 = (auVar270._0_4_ - local_178) * fVar281;
          fVar282 = (auVar270._4_4_ - fStack_174) * fVar282;
          fVar283 = (auVar270._8_4_ - fStack_170) * fVar283;
          fVar289 = (auVar270._12_4_ - fStack_16c) * fVar289;
          fVar290 = ((float)local_318._0_4_ * fVar303 + fVar230) * fVar124;
          fVar291 = ((float)local_318._4_4_ * fVar304 + fVar231) * fVar129;
          fVar292 = (fStack_310 * fVar307 + fVar232) * fVar167;
          fVar302 = (fStack_30c * fVar312 + fVar240) * fVar183;
          local_538._4_4_ = fStack_364 * fVar304 - ((float)local_308._4_4_ * fVar291 + fVar319);
          local_538._0_4_ = local_368 * fVar303 - ((float)local_308._0_4_ * fVar290 + fVar316);
          fStack_530 = fStack_360 * fVar307 - (fStack_300 * fVar292 + fVar320);
          fStack_52c = fStack_35c * fVar312 - (fStack_2fc * fVar302 + fVar321);
          local_548._4_4_ = fStack_424 * fVar304 - (fVar265 * fVar291 + fVar156);
          local_548._0_4_ = local_428 * fVar303 - (fVar241 * fVar290 + fVar126);
          fStack_540 = fStack_420 * fVar307 - (fVar306 * fVar292 + fVar169);
          fStack_53c = fStack_41c * fVar312 - (fVar264 * fVar302 + fVar184);
          fVar124 = ((float)local_318._0_4_ * fVar281 + fVar230) * fVar124;
          fVar129 = ((float)local_318._4_4_ * fVar282 + fVar231) * fVar129;
          fVar167 = (fStack_310 * fVar283 + fVar232) * fVar167;
          fVar183 = (fStack_30c * fVar289 + fVar240) * fVar183;
          local_558._4_4_ = fStack_364 * fVar282 - ((float)local_308._4_4_ * fVar129 + fVar319);
          local_558._0_4_ = local_368 * fVar281 - ((float)local_308._0_4_ * fVar124 + fVar316);
          fStack_550 = fStack_360 * fVar283 - (fStack_300 * fVar167 + fVar320);
          fStack_54c = fStack_35c * fVar289 - (fStack_2fc * fVar183 + fVar321);
          fVar126 = local_428 * fVar281 - (fVar241 * fVar124 + fVar126);
          fVar156 = fStack_424 * fVar282 - (fVar265 * fVar129 + fVar156);
          fVar169 = fStack_420 * fVar283 - (fVar306 * fVar167 + fVar169);
          fVar184 = fStack_41c * fVar289 - (fVar264 * fVar183 + fVar184);
          bVar22 = 0.0 <= auVar237._0_4_;
          uVar78 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar237._4_4_;
          uVar81 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar237._8_4_;
          uVar125 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar237._12_4_;
          uVar127 = -(uint)bVar25;
          auVar193._0_4_ = local_4d8 * fVar281 - (fVar124 * (float)local_4a8._0_4_ + fVar242);
          auVar193._4_4_ = fStack_4d4 * fVar282 - (fVar129 * (float)local_4a8._4_4_ + fVar254);
          auVar193._8_4_ = fStack_4d0 * fVar283 - (fVar167 * fStack_4a0 + fVar275);
          auVar193._12_4_ = fStack_4cc * fVar289 - (fVar183 * fStack_49c + fVar263);
          auVar238._0_4_ = (uint)fVar303 & uVar78;
          auVar238._4_4_ = (uint)fVar304 & uVar81;
          auVar238._8_4_ = (uint)fVar307 & uVar125;
          auVar238._12_4_ = (uint)fVar312 & uVar127;
          auVar252._0_8_ = CONCAT44(~uVar81,~uVar78) & 0x7f8000007f800000;
          auVar252._8_4_ = ~uVar125 & 0x7f800000;
          auVar252._12_4_ = ~uVar127 & 0x7f800000;
          auVar252 = auVar252 | auVar238;
          auVar225._0_4_ = (uint)fVar281 & uVar78;
          auVar225._4_4_ = (uint)fVar282 & uVar81;
          auVar225._8_4_ = (uint)fVar283 & uVar125;
          auVar225._12_4_ = (uint)fVar289 & uVar127;
          auVar163._0_8_ = CONCAT44(~uVar81,~uVar78) & 0xff800000ff800000;
          auVar163._8_4_ = ~uVar125 & 0xff800000;
          auVar163._12_4_ = ~uVar127 & 0xff800000;
          auVar163 = auVar163 | auVar225;
          auVar108._0_8_ = CONCAT44(fStack_324,local_328) & 0x7fffffff7fffffff;
          auVar108._8_4_ = ABS(fStack_320);
          auVar108._12_4_ = ABS(fStack_31c);
          auVar37._4_4_ = fStack_2b4;
          auVar37._0_4_ = local_2b8;
          auVar37._8_4_ = fStack_2b0;
          auVar37._12_4_ = fStack_2ac;
          auVar158 = maxps(auVar37,auVar108);
          fVar124 = auVar158._0_4_ * 1.9073486e-06;
          fVar129 = auVar158._4_4_ * 1.9073486e-06;
          fVar167 = auVar158._8_4_ * 1.9073486e-06;
          fVar183 = auVar158._12_4_ * 1.9073486e-06;
          auVar226._0_4_ = -(uint)(ABS(fVar185) < fVar124 && bVar22);
          auVar226._4_4_ = -(uint)(ABS(fVar203) < fVar129 && bVar23);
          auVar226._8_4_ = -(uint)(ABS(fVar204) < fVar167 && bVar24);
          auVar226._12_4_ = -(uint)(ABS(fVar205) < fVar183 && bVar25);
          iVar61 = movmskps(iVar61,auVar226);
          local_498._4_4_ = fStack_4d4 * fVar304 - (fVar291 * (float)local_4a8._4_4_ + fVar254);
          local_498._0_4_ = local_4d8 * fVar303 - (fVar290 * (float)local_4a8._0_4_ + fVar242);
          fStack_490 = fStack_4d0 * fVar307 - (fVar292 * fStack_4a0 + fVar275);
          fStack_48c = fStack_4cc * fVar312 - (fVar302 * fStack_49c + fVar263);
          if (iVar61 != 0) {
            uVar78 = -(uint)(auVar162._0_4_ <= 0.0);
            uVar81 = -(uint)(auVar162._4_4_ <= 0.0);
            uVar125 = -(uint)(auVar162._8_4_ <= 0.0);
            uVar127 = -(uint)(auVar162._12_4_ <= 0.0);
            auVar272._0_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar226._0_4_;
            auVar272._4_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar226._4_4_;
            auVar272._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar226._8_4_;
            auVar272._12_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar226._12_4_;
            auVar262._0_4_ = ~auVar226._0_4_ & auVar252._0_4_;
            auVar262._4_4_ = ~auVar226._4_4_ & auVar252._4_4_;
            auVar262._8_4_ = ~auVar226._8_4_ & auVar252._8_4_;
            auVar262._12_4_ = ~auVar226._12_4_ & auVar252._12_4_;
            auVar252 = auVar262 | auVar272;
            auVar273._0_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar226._0_4_;
            auVar273._4_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar226._4_4_;
            auVar273._8_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar226._8_4_;
            auVar273._12_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar226._12_4_;
            auVar229._0_4_ = ~auVar226._0_4_ & auVar163._0_4_;
            auVar229._4_4_ = ~auVar226._4_4_ & auVar163._4_4_;
            auVar229._8_4_ = ~auVar226._8_4_ & auVar163._8_4_;
            auVar229._12_4_ = ~auVar226._12_4_ & auVar163._12_4_;
            auVar163 = auVar229 | auVar273;
            local_438._4_4_ = -(uint)((fVar129 <= ABS(fVar203) || auVar162._4_4_ <= 0.0) && bVar23);
            local_438._0_4_ = -(uint)((fVar124 <= ABS(fVar185) || auVar162._0_4_ <= 0.0) && bVar22);
            fStack_430 = (float)-(uint)((fVar167 <= ABS(fVar204) || auVar162._8_4_ <= 0.0) && bVar24
                                       );
            fStack_42c = (float)-(uint)((fVar183 <= ABS(fVar205) || auVar162._12_4_ <= 0.0) &&
                                       bVar25);
          }
        }
        fVar124 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar129 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar167 = (ray->super_RayK<1>).dir.field_0.m128[2];
        _local_138 = _local_408;
        local_128 = minps(auVar82,auVar252);
        _local_4a8 = maxps(_local_408,auVar163);
        _local_1f8 = _local_4a8;
        local_1e8 = auVar82;
        auVar239._0_4_ = -(uint)(fVar253 <= local_128._0_4_) & local_4c8._0_4_;
        auVar239._4_4_ = -(uint)(fVar274 <= local_128._4_4_) & local_4c8._4_4_;
        auVar239._8_4_ = -(uint)(fVar257 <= local_128._8_4_) & (uint)fStack_4c0;
        auVar239._12_4_ = -(uint)(fVar276 <= local_128._12_4_) & (uint)fStack_4bc;
        auVar146._0_8_ =
             CONCAT44(-(uint)((float)local_4a8._4_4_ <= auVar82._4_4_) & local_4c8._4_4_,
                      -(uint)((float)local_4a8._0_4_ <= auVar82._0_4_) & local_4c8._0_4_);
        auVar146._8_4_ = -(uint)(fStack_4a0 <= auVar82._8_4_) & (uint)fStack_4c0;
        auVar146._12_4_ = -(uint)(fStack_49c <= auVar82._12_4_) & (uint)fStack_4bc;
        auVar109._8_4_ = auVar146._8_4_;
        auVar109._0_8_ = auVar146._0_8_;
        auVar109._12_4_ = auVar146._12_4_;
        iVar61 = movmskps(iVar61,auVar109 | auVar239);
        auVar248 = _local_4c8;
        if (iVar61 != 0) {
          _local_318 = auVar146;
          local_328 = fVar168;
          fStack_324 = fVar168;
          fStack_320 = fVar168;
          fStack_31c = fVar168;
          local_498._0_4_ =
               -(uint)((int)fVar168 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._0_4_ * fVar167 +
                                                 (float)local_548._0_4_ * fVar129 +
                                                 (float)local_538._0_4_ * fVar124)) &
                             local_438._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)fVar168 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._4_4_ * fVar167 +
                                                 (float)local_548._4_4_ * fVar129 +
                                                 (float)local_538._4_4_ * fVar124)) &
                             local_438._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_490 = (float)-(uint)((int)fVar168 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_490 * fVar167 +
                                                                fStack_540 * fVar129 +
                                                                fStack_530 * fVar124)) &
                                            (uint)fStack_430) << 0x1f) >> 0x1f) + 4);
          fStack_48c = (float)-(uint)((int)fVar168 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_48c * fVar167 +
                                                                fStack_53c * fVar129 +
                                                                fStack_52c * fVar124)) &
                                            (uint)fStack_42c) << 0x1f) >> 0x1f) + 4);
          _local_308 = auVar239;
          local_2e8 = ~_local_498 & auVar239;
          iVar61 = movmskps(iVar61,local_2e8);
          if (iVar61 == 0) {
            fVar183 = (ray->super_RayK<1>).tfar;
            fVar185 = (float)local_4a8._0_4_;
            fVar203 = (float)local_4a8._4_4_;
            fVar204 = fStack_4a0;
            fVar205 = fStack_49c;
          }
          else {
            local_418 = local_488 + fVar253;
            fStack_414 = fStack_484 + fVar274;
            fStack_410 = fStack_480 + fVar257;
            fStack_40c = fStack_47c + fVar276;
            do {
              auVar158 = ~local_2e8 & _DAT_01f7a9f0 | local_2e8 & _local_408;
              auVar176._4_4_ = auVar158._0_4_;
              auVar176._0_4_ = auVar158._4_4_;
              auVar176._8_4_ = auVar158._12_4_;
              auVar176._12_4_ = auVar158._8_4_;
              auVar82 = minps(auVar176,auVar158);
              auVar110._0_8_ = auVar82._8_8_;
              auVar110._8_4_ = auVar82._0_4_;
              auVar110._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar110,auVar82);
              auVar111._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar158._4_4_) & local_2e8._4_4_,
                            -(uint)(auVar82._0_4_ == auVar158._0_4_) & local_2e8._0_4_);
              auVar111._8_4_ = -(uint)(auVar82._8_4_ == auVar158._8_4_) & local_2e8._8_4_;
              auVar111._12_4_ = -(uint)(auVar82._12_4_ == auVar158._12_4_) & local_2e8._12_4_;
              iVar61 = movmskps(iVar61,auVar111);
              auVar147 = local_2e8;
              if (iVar61 != 0) {
                auVar147._8_4_ = auVar111._8_4_;
                auVar147._0_8_ = auVar111._0_8_;
                auVar147._12_4_ = auVar111._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar147);
              pRVar64 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar64 & 1) == 0;
                    pRVar64 = (RayHit *)((long)(pRVar64->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2e8 + (long)pRVar64 * 4) = 0;
              fVar183 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar185 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar203 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar204 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar34._4_4_ = fStack_334;
              auVar34._0_4_ = local_338;
              auVar34._8_4_ = fStack_330;
              auVar34._12_4_ = fStack_32c;
              auVar32._4_4_ = fStack_344;
              auVar32._0_4_ = local_348;
              auVar32._8_4_ = fStack_340;
              auVar32._12_4_ = fStack_33c;
              auVar158 = minps(auVar34,auVar32);
              auVar270 = maxps(auVar34,auVar32);
              auVar30._4_4_ = fStack_354;
              auVar30._0_4_ = local_358;
              auVar30._8_4_ = fStack_350;
              auVar30._12_4_ = fStack_34c;
              auVar82 = minps(auVar30,_local_478);
              auVar158 = minps(auVar158,auVar82);
              auVar82 = maxps(auVar30,_local_478);
              auVar82 = maxps(auVar270,auVar82);
              auVar194._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
              auVar194._8_4_ = auVar158._8_4_ & 0x7fffffff;
              auVar194._12_4_ = auVar158._12_4_ & 0x7fffffff;
              local_3f8 = auVar82._12_4_;
              auVar112._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar112._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar112._12_4_ = ABS(local_3f8);
              auVar82 = maxps(auVar194,auVar112);
              fVar205 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar205 = auVar82._0_4_;
              }
              auVar195._8_8_ = auVar82._8_8_;
              auVar195._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar205) {
                auVar195._0_4_ = fVar205;
              }
              fVar231 = auVar195._0_4_ * 1.9073486e-06;
              fStack_3f4 = local_3f8;
              fStack_3f0 = local_3f8;
              fStack_3ec = local_3f8;
              fVar205 = local_108[(long)pRVar64];
              fVar230 = *(float *)(local_138 + (long)pRVar64 * 4);
              lVar74 = 5;
              do {
                fVar232 = SQRT(fVar203 * fVar203 + fVar185 * fVar185 + fVar183 * fVar183) *
                          1.9073486e-06 * fVar230;
                fVar242 = 1.0 - fVar205;
                fVar253 = fVar205 * 3.0;
                fVar240 = -fVar205 * fVar242 * fVar242 * 0.5;
                fVar257 = (fVar205 * fVar205 * (fVar253 + -5.0) + 2.0) * 0.5;
                fVar306 = ((fVar242 * 3.0 + -5.0) * fVar242 * fVar242 + 2.0) * 0.5;
                fVar263 = -fVar242 * fVar205 * fVar205 * 0.5;
                fVar241 = fVar240 * fStack_32c +
                          fVar257 * fStack_33c + fVar306 * fStack_34c + fVar263 * fStack_46c;
                fVar274 = (fVar205 * (fVar242 + fVar242) - fVar242 * fVar242) * 0.5;
                fVar265 = ((fVar205 + fVar205) * (fVar253 + -5.0) + fVar205 * fVar253) * 0.5;
                fVar254 = ((fVar253 + 2.0) * (fVar242 + fVar242) + fVar242 * -3.0 * fVar242) * 0.5;
                fVar242 = (fVar242 * -2.0 * fVar205 + fVar205 * fVar205) * 0.5;
                fVar264 = fVar274 * local_338 +
                          fVar265 * local_348 +
                          fVar254 * local_358 + fVar242 * (float)local_478._0_4_;
                fVar276 = fVar274 * fStack_334 +
                          fVar265 * fStack_344 +
                          fVar254 * fStack_354 + fVar242 * (float)local_478._4_4_;
                fVar281 = fVar274 * fStack_330 +
                          fVar265 * fStack_340 + fVar254 * fStack_350 + fVar242 * fStack_470;
                fVar282 = fVar274 * fStack_32c +
                          fVar265 * fStack_33c + fVar254 * fStack_34c + fVar242 * fStack_46c;
                fVar254 = fVar205 * -3.0 + 2.0;
                fVar275 = fVar205 * 9.0 + -5.0;
                fVar242 = fVar205 * -9.0 + 4.0;
                fVar253 = fVar253 + -1.0;
                fVar265 = fVar254 * local_338 +
                          fVar275 * local_348 +
                          fVar242 * local_358 + fVar253 * (float)local_478._0_4_;
                fVar274 = fVar254 * fStack_334 +
                          fVar275 * fStack_344 +
                          fVar242 * fStack_354 + fVar253 * (float)local_478._4_4_;
                fVar242 = fVar254 * fStack_330 +
                          fVar275 * fStack_340 + fVar242 * fStack_350 + fVar253 * fStack_470;
                local_398._0_4_ =
                     (fVar230 * fVar183 + 0.0) -
                     (fVar240 * local_338 +
                     fVar257 * local_348 + fVar306 * local_358 + fVar263 * (float)local_478._0_4_);
                local_398._4_4_ =
                     (fVar230 * fVar185 + 0.0) -
                     (fVar240 * fStack_334 +
                     fVar257 * fStack_344 + fVar306 * fStack_354 + fVar263 * (float)local_478._4_4_)
                ;
                fStack_390 = (fVar230 * fVar203 + 0.0) -
                             (fVar240 * fStack_330 +
                             fVar257 * fStack_340 + fVar306 * fStack_350 + fVar263 * fStack_470);
                fStack_38c = (fVar230 * fVar204 + 0.0) - fVar241;
                fVar240 = (float)local_398._4_4_ * (float)local_398._4_4_;
                fStack_380 = fStack_390 * fStack_390;
                fStack_37c = fStack_38c * fStack_38c;
                local_388 = fVar240 + (float)local_398._0_4_ * (float)local_398._0_4_ + fStack_380;
                fStack_384 = fVar240 + fVar240 + fStack_37c;
                fStack_380 = fVar240 + fStack_380 + fStack_380;
                fStack_37c = fVar240 + fStack_37c + fStack_37c;
                local_548._4_4_ = auVar195._4_4_;
                fStack_540 = auVar195._8_4_;
                fStack_53c = auVar195._12_4_;
                local_4c8._0_4_ = fVar231;
                if (fVar231 <= fVar232) {
                  local_4c8._0_4_ = fVar232;
                }
                fVar253 = fVar276 * fVar276 + fVar264 * fVar264 + fVar281 * fVar281;
                auVar158 = ZEXT416((uint)fVar253);
                auVar82 = rsqrtss(ZEXT416((uint)fVar253),auVar158);
                fVar232 = auVar82._0_4_;
                fVar275 = fVar232 * 1.5 - fVar232 * fVar232 * fVar253 * 0.5 * fVar232;
                fVar289 = fVar264 * fVar275;
                fVar291 = fVar276 * fVar275;
                fVar292 = fVar281 * fVar275;
                fVar302 = fVar282 * fVar275;
                fVar306 = fVar242 * fVar281 + fVar274 * fVar276 + fVar265 * fVar264;
                auVar82 = rcpss(auVar158,auVar158);
                fVar240 = (2.0 - fVar253 * auVar82._0_4_) * auVar82._0_4_;
                fVar254 = (float)local_398._4_4_ * fVar291;
                fVar257 = fStack_390 * fVar292;
                fVar263 = fStack_38c * fVar302;
                fVar232 = fVar254 + (float)local_398._0_4_ * fVar289 + fVar257;
                fVar283 = fVar254 + fVar254 + fVar263;
                fVar257 = fVar254 + fVar257 + fVar257;
                fVar263 = fVar254 + fVar263 + fVar263;
                local_4c8._4_4_ = local_548._4_4_;
                fStack_4c0 = fStack_540;
                fStack_4bc = fStack_53c;
                fVar303 = (SQRT(local_388) + 1.0) * (fVar231 / SQRT(fVar253)) +
                          SQRT(local_388) * fVar231 + (float)local_4c8._0_4_;
                fVar254 = fVar204 * fVar302;
                fVar302 = fVar302 * -fVar282;
                fVar290 = fVar292 * -fVar281 + fVar291 * -fVar276 + fVar289 * -fVar264 +
                          fVar240 * (fVar253 * fVar242 - fVar306 * fVar281) * fVar275 * fStack_390 +
                          fVar240 * (fVar253 * fVar274 - fVar306 * fVar276) * fVar275 *
                          (float)local_398._4_4_ +
                          fVar240 * (fVar253 * fVar265 - fVar306 * fVar264) * fVar275 *
                          (float)local_398._0_4_;
                fVar253 = fVar203 * fVar292 + fVar185 * fVar291 + fVar183 * fVar289;
                fVar275 = local_388 - fVar232 * fVar232;
                auVar113._0_8_ = CONCAT44(fStack_384 - fVar283 * fVar283,fVar275);
                auVar113._8_4_ = fStack_380 - fVar257 * fVar257;
                auVar113._12_4_ = fStack_37c - fVar263 * fVar263;
                fVar289 = -fVar281 * fStack_390;
                fVar274 = -fVar282 * fStack_38c;
                local_598 = CONCAT44(fVar302,fVar290);
                fVar265 = (fVar289 +
                          -fVar276 * (float)local_398._4_4_ + -fVar264 * (float)local_398._0_4_) -
                          fVar232 * fVar290;
                fVar242 = fVar204 * fStack_38c;
                fVar240 = (fVar203 * fStack_390 +
                          fVar185 * (float)local_398._4_4_ + fVar183 * (float)local_398._0_4_) -
                          fVar232 * fVar253;
                auVar148._8_4_ = auVar113._8_4_;
                auVar148._0_8_ = auVar113._0_8_;
                auVar148._12_4_ = auVar113._12_4_;
                auVar82 = rsqrtss(auVar148,auVar113);
                fVar306 = auVar82._0_4_;
                auVar177._0_4_ = fVar306 * 1.5 - fVar306 * fVar306 * fVar275 * 0.5 * fVar306;
                auVar177._4_12_ = auVar82._4_12_;
                if (fVar275 < 0.0) {
                  _local_3e8 = auVar177;
                  local_3d8 = fVar240;
                  fStack_3d4 = fVar242;
                  fStack_3d0 = fVar203 * fStack_390;
                  fStack_3cc = fVar242;
                  local_3c8 = fVar253;
                  fStack_3c4 = fVar254;
                  fStack_3c0 = fVar203 * fVar292;
                  fStack_3bc = fVar254;
                  local_3b8 = fVar232;
                  fStack_3b4 = fVar283;
                  fStack_3b0 = fVar257;
                  fStack_3ac = fVar263;
                  local_3a8 = fVar265;
                  fStack_3a4 = fVar274;
                  fStack_3a0 = fVar289;
                  fStack_39c = fVar274;
                  fVar275 = sqrtf(fVar275);
                  pRVar64 = extraout_RAX;
                  auVar177 = _local_3e8;
                  fVar232 = local_3b8;
                  fVar240 = local_3d8;
                  fVar242 = fStack_3d4;
                  fVar253 = local_3c8;
                  fVar254 = fStack_3c4;
                  fVar265 = local_3a8;
                  fVar274 = fStack_3a4;
                }
                else {
                  fVar275 = SQRT(fVar275);
                }
                fVar275 = fVar275 - fVar241;
                fVar241 = fVar265 * auVar177._0_4_ - fVar282;
                fVar240 = fVar240 * auVar177._0_4_;
                auVar311._0_8_ = CONCAT44(fVar274,fVar241) ^ 0x8000000080000000;
                auVar178._0_4_ = fVar290 * fVar240 - fVar253 * fVar241;
                auVar311._8_4_ = -fVar274;
                auVar311._12_4_ = fVar242;
                auVar310._8_8_ = auVar311._8_8_;
                auVar310._0_8_ = CONCAT44(fVar240,fVar241) ^ 0x80000000;
                auVar178._4_4_ = auVar178._0_4_;
                auVar178._8_4_ = auVar178._0_4_;
                auVar178._12_4_ = auVar178._0_4_;
                auVar158 = divps(auVar310,auVar178);
                auVar197._8_4_ = fVar302;
                auVar197._0_8_ = local_598;
                auVar197._12_4_ = -fVar254;
                auVar196._8_8_ = auVar197._8_8_;
                auVar196._0_8_ = CONCAT44(fVar253,fVar290) ^ 0x8000000000000000;
                auVar82 = divps(auVar196,auVar178);
                fVar230 = fVar230 - (fVar275 * auVar82._0_4_ + fVar232 * auVar158._0_4_);
                fVar205 = fVar205 - (fVar275 * auVar82._4_4_ + fVar232 * auVar158._4_4_);
                if ((ABS(fVar232) < fVar303) &&
                   (ABS(fVar275) < local_3f8 * 1.9073486e-06 + (float)local_4c8._0_4_ + fVar303)) {
                  fVar230 = local_2f8._0_4_ + fVar230;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar230) &&
                     (((fVar183 = (ray->super_RayK<1>).tfar, fVar230 <= fVar183 && (0.0 <= fVar205))
                      && (fVar205 <= 1.0)))) {
                    auVar28._4_4_ = fStack_384;
                    auVar28._0_4_ = local_388;
                    auVar28._8_4_ = fStack_380;
                    auVar28._12_4_ = fStack_37c;
                    auVar82 = rsqrtss(auVar28,auVar28);
                    fVar185 = auVar82._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)pRVar69].ptr;
                    uVar78 = (ray->super_RayK<1>).mask;
                    pRVar64 = (RayHit *)(ulong)uVar78;
                    pRVar68 = pRVar69;
                    if ((pGVar19->mask & uVar78) != 0) {
                      fVar231 = fVar185 * 1.5 + fVar185 * fVar185 * local_388 * -0.5 * fVar185;
                      fVar232 = (float)local_398._0_4_ * fVar231;
                      fVar241 = (float)local_398._4_4_ * fVar231;
                      fVar231 = fStack_390 * fVar231;
                      fVar185 = fVar282 * fVar232 + fVar264;
                      fVar203 = fVar282 * fVar241 + fVar276;
                      fVar204 = fVar282 * fVar231 + fVar281;
                      fVar240 = fVar241 * fVar264 - fVar276 * fVar232;
                      fVar241 = fVar231 * fVar276 - fVar281 * fVar241;
                      fVar232 = fVar232 * fVar281 - fVar264 * fVar231;
                      fVar231 = fVar203 * fVar241 - fVar232 * fVar185;
                      fVar203 = fVar204 * fVar232 - fVar240 * fVar203;
                      fVar185 = fVar185 * fVar240 - fVar241 * fVar204;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar230;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar185,fVar203);
                        (ray->Ng).field_0.field_0.z = fVar231;
                        ray->u = fVar205;
                        ray->v = 0.0;
                        ray->primID = uVar77;
                        ray->geomID = uVar76;
                        ray->instID[0] = context->user->instID[0];
                        uVar78 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar78;
                        pRVar64 = (RayHit *)(ulong)uVar78;
                      }
                      else {
                        local_468 = CONCAT44(fVar185,fVar203);
                        fStack_460 = fVar231;
                        fStack_45c = fVar205;
                        local_458 = 0;
                        local_454 = uVar77;
                        local_450 = uVar76;
                        local_44c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_44c;
                        local_448 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar230;
                        local_378._0_4_ = 0xffffffff;
                        local_508.geometryUserPtr = pGVar19->userPtr;
                        local_508.valid = (int *)local_378;
                        local_508.context = context->user;
                        local_508.hit = (RTCHitN *)&local_468;
                        local_508.N = 1;
                        local_508.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b39cbc:
                          pRVar68 = context->args;
                          if ((pRVar68->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar68->filter)(&local_508);
                            if ((((RayK<1> *)local_508.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b39d65;
                          }
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_508.hit;
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_508.hit + 4);
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_508.hit + 8);
                          *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                          *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                          *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                          *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                          *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_508.hit + 0x20);
                          *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                          pRVar64 = (RayHit *)local_508.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_508);
                          if ((((RayK<1> *)local_508.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b39cbc;
LAB_00b39d65:
                          (ray->super_RayK<1>).tfar = fVar183;
                          pRVar64 = (RayHit *)local_508.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              fVar183 = (ray->super_RayK<1>).tfar;
              local_2e8._0_4_ = -(uint)(local_418 <= fVar183) & local_2e8._0_4_;
              local_2e8._4_4_ = -(uint)(fStack_414 <= fVar183) & local_2e8._4_4_;
              local_2e8._8_4_ = -(uint)(fStack_410 <= fVar183) & local_2e8._8_4_;
              local_2e8._12_4_ = -(uint)(fStack_40c <= fVar183) & local_2e8._12_4_;
              uVar67 = (undefined4)((ulong)pRVar64 >> 0x20);
              iVar61 = movmskps((int)pRVar64,local_2e8);
            } while (iVar61 != 0);
            fVar185 = (float)local_1f8._0_4_;
            fVar203 = (float)local_1f8._4_4_;
            fVar204 = fStack_1f0;
            fVar205 = fStack_1ec;
          }
          uVar62 = SUB84(pRVar68,0);
          local_4a8._0_4_ = -(uint)((float)local_4a8._0_4_ + local_488 <= fVar183) & local_318._0_4_
          ;
          local_4a8._4_4_ =
               -(uint)((float)local_4a8._4_4_ + fStack_484 <= fVar183) & local_318._4_4_;
          fStack_4a0 = (float)(-(uint)(fStack_4a0 + fStack_480 <= fVar183) & (uint)fStack_310);
          fStack_49c = (float)(-(uint)(fStack_49c + fStack_47c <= fVar183) & (uint)fStack_30c);
          auVar149._0_4_ =
               -(uint)((int)local_328 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_558._0_4_ * fVar124 +
                                                 fVar126 * fVar129 + auVar193._0_4_ * fVar167)) &
                             local_438._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar149._4_4_ =
               -(uint)((int)fStack_324 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_558._4_4_ * fVar124 +
                                                 fVar156 * fVar129 + auVar193._4_4_ * fVar167)) &
                             local_438._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar149._8_4_ =
               -(uint)((int)fStack_320 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_550 * fVar124 +
                                                 fVar169 * fVar129 + auVar193._8_4_ * fVar167)) &
                             (uint)fStack_430) << 0x1f) >> 0x1f) + 4);
          auVar149._12_4_ =
               -(uint)((int)fStack_31c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_54c * fVar124 +
                                                 fVar184 * fVar129 + auVar193._12_4_ * fVar167)) &
                             (uint)fStack_42c) << 0x1f) >> 0x1f) + 4);
          local_378 = ~auVar149 & _local_4a8;
          iVar61 = movmskps(0,local_378);
          if (iVar61 != 0) {
            local_418 = local_488 + fVar185;
            fStack_414 = fStack_484 + fVar203;
            fStack_410 = fStack_480 + fVar204;
            fStack_40c = fStack_47c + fVar205;
            local_408._4_4_ = fVar203;
            local_408._0_4_ = fVar185;
            fStack_400 = fVar204;
            fStack_3fc = fVar205;
            do {
              uVar78 = local_378._0_4_;
              uVar81 = local_378._4_4_;
              uVar125 = local_378._8_4_;
              uVar127 = local_378._12_4_;
              auVar114._0_4_ = uVar78 & (uint)fVar185;
              auVar114._4_4_ = uVar81 & (uint)fVar203;
              auVar114._8_4_ = uVar125 & (uint)fVar204;
              auVar114._12_4_ = uVar127 & (uint)fVar205;
              auVar164._0_8_ = CONCAT44(~uVar81,~uVar78) & 0x7f8000007f800000;
              auVar164._8_4_ = ~uVar125 & 0x7f800000;
              auVar164._12_4_ = ~uVar127 & 0x7f800000;
              auVar164 = auVar164 | auVar114;
              auVar179._4_4_ = auVar164._0_4_;
              auVar179._0_4_ = auVar164._4_4_;
              auVar179._8_4_ = auVar164._12_4_;
              auVar179._12_4_ = auVar164._8_4_;
              auVar82 = minps(auVar179,auVar164);
              auVar115._0_8_ = auVar82._8_8_;
              auVar115._8_4_ = auVar82._0_4_;
              auVar115._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar115,auVar82);
              auVar116._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar164._4_4_) & uVar81,
                            -(uint)(auVar82._0_4_ == auVar164._0_4_) & uVar78);
              auVar116._8_4_ = -(uint)(auVar82._8_4_ == auVar164._8_4_) & uVar125;
              auVar116._12_4_ = -(uint)(auVar82._12_4_ == auVar164._12_4_) & uVar127;
              iVar61 = movmskps(iVar61,auVar116);
              auVar150 = local_378;
              if (iVar61 != 0) {
                auVar150._8_4_ = auVar116._8_4_;
                auVar150._0_8_ = auVar116._0_8_;
                auVar150._12_4_ = auVar116._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar150);
              pRVar64 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar64 & 1) == 0;
                    pRVar64 = (RayHit *)((long)(pRVar64->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_378 + (long)pRVar64 * 4) = 0;
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar126 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar129 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar156 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar35._4_4_ = fStack_334;
              auVar35._0_4_ = local_338;
              auVar35._8_4_ = fStack_330;
              auVar35._12_4_ = fStack_32c;
              auVar33._4_4_ = fStack_344;
              auVar33._0_4_ = local_348;
              auVar33._8_4_ = fStack_340;
              auVar33._12_4_ = fStack_33c;
              auVar158 = minps(auVar35,auVar33);
              auVar270 = maxps(auVar35,auVar33);
              auVar31._4_4_ = fStack_354;
              auVar31._0_4_ = local_358;
              auVar31._8_4_ = fStack_350;
              auVar31._12_4_ = fStack_34c;
              auVar82 = minps(auVar31,_local_478);
              auVar158 = minps(auVar158,auVar82);
              auVar82 = maxps(auVar31,_local_478);
              auVar82 = maxps(auVar270,auVar82);
              auVar198._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
              auVar198._8_4_ = auVar158._8_4_ & 0x7fffffff;
              auVar198._12_4_ = auVar158._12_4_ & 0x7fffffff;
              local_3f8 = auVar82._12_4_;
              auVar117._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar117._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar117._12_4_ = ABS(local_3f8);
              auVar82 = maxps(auVar198,auVar117);
              fVar167 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar167 = auVar82._0_4_;
              }
              auVar199._8_8_ = auVar82._8_8_;
              auVar199._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar167) {
                auVar199._0_4_ = fVar167;
              }
              register0x00001304 = auVar199._4_12_;
              local_398._0_4_ = auVar199._0_4_ * 1.9073486e-06;
              local_388 = SQRT(fVar129 * fVar129 + fVar126 * fVar126 + fVar124 * fVar124) *
                          1.9073486e-06;
              fStack_3f4 = local_3f8;
              fStack_3f0 = local_3f8;
              fStack_3ec = local_3f8;
              fVar167 = local_118[(long)pRVar64];
              fVar169 = *(float *)(local_1e8 + (long)pRVar64 * 4);
              lVar74 = 5;
              do {
                fVar184 = 1.0 - fVar167;
                fVar203 = fVar167 * 3.0;
                fVar183 = -fVar167 * fVar184 * fVar184 * 0.5;
                fVar240 = (fVar167 * fVar167 * (fVar203 + -5.0) + 2.0) * 0.5;
                fVar232 = ((fVar184 * 3.0 + -5.0) * fVar184 * fVar184 + 2.0) * 0.5;
                fVar241 = -fVar184 * fVar167 * fVar167 * 0.5;
                fVar185 = fVar183 * fStack_32c +
                          fVar240 * fStack_33c + fVar232 * fStack_34c + fVar241 * fStack_46c;
                fVar230 = (fVar167 * (fVar184 + fVar184) - fVar184 * fVar184) * 0.5;
                fVar205 = ((fVar167 + fVar167) * (fVar203 + -5.0) + fVar167 * fVar203) * 0.5;
                fVar204 = ((fVar203 + 2.0) * (fVar184 + fVar184) + fVar184 * -3.0 * fVar184) * 0.5;
                fVar184 = (fVar184 * -2.0 * fVar167 + fVar167 * fVar167) * 0.5;
                fVar242 = fVar230 * local_338 +
                          fVar205 * local_348 +
                          fVar204 * local_358 + fVar184 * (float)local_478._0_4_;
                fVar253 = fVar230 * fStack_334 +
                          fVar205 * fStack_344 +
                          fVar204 * fStack_354 + fVar184 * (float)local_478._4_4_;
                fVar254 = fVar230 * fStack_330 +
                          fVar205 * fStack_340 + fVar204 * fStack_350 + fVar184 * fStack_470;
                fVar265 = fVar230 * fStack_32c +
                          fVar205 * fStack_33c + fVar204 * fStack_34c + fVar184 * fStack_46c;
                fVar204 = fVar167 * -3.0 + 2.0;
                fVar231 = fVar167 * 9.0 + -5.0;
                fVar184 = fVar167 * -9.0 + 4.0;
                fVar203 = fVar203 + -1.0;
                fVar205 = fVar204 * local_338 +
                          fVar231 * local_348 +
                          fVar184 * local_358 + fVar203 * (float)local_478._0_4_;
                fVar230 = fVar204 * fStack_334 +
                          fVar231 * fStack_344 +
                          fVar184 * fStack_354 + fVar203 * (float)local_478._4_4_;
                fVar203 = fVar204 * fStack_330 +
                          fVar231 * fStack_340 + fVar184 * fStack_350 + fVar203 * fStack_470;
                fVar204 = (fVar169 * fVar124 + 0.0) -
                          (fVar183 * local_338 +
                          fVar240 * local_348 +
                          fVar232 * local_358 + fVar241 * (float)local_478._0_4_);
                fVar231 = (fVar169 * fVar126 + 0.0) -
                          (fVar183 * fStack_334 +
                          fVar240 * fStack_344 +
                          fVar232 * fStack_354 + fVar241 * (float)local_478._4_4_);
                fVar232 = (fVar169 * fVar129 + 0.0) -
                          (fVar183 * fStack_330 +
                          fVar240 * fStack_340 + fVar232 * fStack_350 + fVar241 * fStack_470);
                fVar184 = (fVar169 * fVar156 + 0.0) - fVar185;
                fVar183 = fVar231 * fVar231;
                fStack_3a0 = fVar232 * fVar232;
                fStack_39c = fVar184 * fVar184;
                local_3a8 = fVar183 + fVar204 * fVar204 + fStack_3a0;
                fStack_3a4 = fVar183 + fVar183 + fStack_39c;
                fStack_3a0 = fVar183 + fStack_3a0 + fStack_3a0;
                fStack_39c = fVar183 + fStack_39c + fStack_39c;
                fVar183 = (float)local_398._0_4_;
                if ((float)local_398._0_4_ <= local_388 * fVar169) {
                  fVar183 = local_388 * fVar169;
                }
                fVar275 = fVar253 * fVar253 + fVar242 * fVar242 + fVar254 * fVar254;
                auVar158 = ZEXT416((uint)fVar275);
                auVar82 = rsqrtss(ZEXT416((uint)fVar275),auVar158);
                fVar240 = auVar82._0_4_;
                fVar306 = fVar240 * 1.5 - fVar240 * fVar240 * fVar275 * 0.5 * fVar240;
                fVar276 = fVar242 * fVar306;
                fVar281 = fVar253 * fVar306;
                fVar282 = fVar254 * fVar306;
                local_538._4_4_ = fVar265 * fVar306;
                fVar264 = fVar203 * fVar254 + fVar230 * fVar253 + fVar205 * fVar242;
                auVar82 = rcpss(auVar158,auVar158);
                fVar274 = (2.0 - fVar275 * auVar82._0_4_) * auVar82._0_4_;
                fVar241 = fVar231 * fVar281;
                fVar257 = fVar232 * fVar282;
                fVar263 = fVar184 * (float)local_538._4_4_;
                fVar240 = fVar241 + fVar204 * fVar276 + fVar257;
                fVar283 = fVar241 + fVar241 + fVar263;
                fVar257 = fVar241 + fVar257 + fVar257;
                fVar263 = fVar241 + fVar263 + fVar263;
                fVar289 = (SQRT(local_3a8) + 1.0) * ((float)local_398._0_4_ / SQRT(fVar275)) +
                          SQRT(local_3a8) * (float)local_398._0_4_ + fVar183;
                fVar241 = fVar156 * (float)local_538._4_4_;
                local_538._4_4_ = (float)local_538._4_4_ * -fVar265;
                local_538._0_4_ =
                     fVar282 * -fVar254 + fVar281 * -fVar253 + fVar276 * -fVar242 +
                     fVar274 * (fVar275 * fVar203 - fVar264 * fVar254) * fVar306 * fVar232 +
                     fVar274 * (fVar275 * fVar230 - fVar264 * fVar253) * fVar306 * fVar231 +
                     fVar274 * (fVar275 * fVar205 - fVar264 * fVar242) * fVar306 * fVar204;
                fVar205 = fVar129 * fVar282 + fVar126 * fVar281 + fVar124 * fVar276;
                fVar230 = local_3a8 - fVar240 * fVar240;
                auVar118._0_8_ = CONCAT44(fStack_3a4 - fVar283 * fVar283,fVar230);
                auVar118._8_4_ = fStack_3a0 - fVar257 * fVar257;
                auVar118._12_4_ = fStack_39c - fVar263 * fVar263;
                fStack_4c0 = -fVar254 * fVar232;
                local_4c8._4_4_ = -fVar265 * fVar184;
                local_4c8._0_4_ =
                     (fStack_4c0 + -fVar253 * fVar231 + -fVar242 * fVar204) -
                     fVar240 * (float)local_538._0_4_;
                fStack_4bc = (float)local_4c8._4_4_;
                fVar184 = fVar156 * fVar184;
                fVar203 = (fVar129 * fVar232 + fVar126 * fVar231 + fVar124 * fVar204) -
                          fVar240 * fVar205;
                auVar151._8_4_ = auVar118._8_4_;
                auVar151._0_8_ = auVar118._0_8_;
                auVar151._12_4_ = auVar118._12_4_;
                auVar82 = rsqrtss(auVar151,auVar118);
                fVar274 = auVar82._0_4_;
                auVar180._0_4_ = fVar274 * 1.5 - fVar274 * fVar274 * fVar230 * 0.5 * fVar274;
                auVar180._4_12_ = auVar82._4_12_;
                if (fVar230 < 0.0) {
                  _local_3e8 = auVar180;
                  local_3d8 = fVar203;
                  fStack_3d4 = fVar184;
                  fStack_3d0 = fVar129 * fVar232;
                  fStack_3cc = fVar184;
                  local_3c8 = fVar205;
                  fStack_3c4 = fVar241;
                  fStack_3c0 = fVar129 * fVar282;
                  fStack_3bc = fVar241;
                  local_3b8 = fVar240;
                  fStack_3b4 = fVar283;
                  fStack_3b0 = fVar257;
                  fStack_3ac = fVar263;
                  fVar230 = sqrtf(fVar230);
                  pRVar64 = extraout_RAX_00;
                  auVar180 = _local_3e8;
                  fVar203 = local_3d8;
                  fVar184 = fStack_3d4;
                  fVar240 = local_3b8;
                  fVar205 = local_3c8;
                  fVar241 = fStack_3c4;
                }
                else {
                  fVar230 = SQRT(fVar230);
                }
                fVar230 = fVar230 - fVar185;
                fVar185 = (float)local_4c8._0_4_ * auVar180._0_4_ - fVar265;
                fVar203 = fVar203 * auVar180._0_4_;
                auVar181._0_4_ = (float)local_538._0_4_ * fVar203 - fVar205 * fVar185;
                auVar201._8_4_ = local_4c8._4_4_ ^ 0x80000000;
                auVar201._0_8_ = CONCAT44(local_4c8._4_4_,fVar185) ^ 0x8000000000000000;
                auVar201._12_4_ = fVar184;
                auVar200._8_8_ = auVar201._8_8_;
                auVar200._0_8_ = CONCAT44(fVar203,fVar185) ^ 0x80000000;
                auVar181._4_4_ = auVar181._0_4_;
                auVar181._8_4_ = auVar181._0_4_;
                auVar181._12_4_ = auVar181._0_4_;
                auVar82 = divps(auVar200,auVar181);
                auVar228._8_4_ = local_538._4_4_;
                auVar228._0_8_ = local_538;
                auVar228._12_4_ = -fVar241;
                auVar227._8_8_ = auVar228._8_8_;
                auVar227._0_8_ = CONCAT44(fVar205,local_538._0_4_) ^ 0x8000000000000000;
                auVar158 = divps(auVar227,auVar181);
                fVar169 = fVar169 - (fVar230 * auVar158._0_4_ + fVar240 * auVar82._0_4_);
                fVar167 = fVar167 - (fVar230 * auVar158._4_4_ + fVar240 * auVar82._4_4_);
                if ((ABS(fVar240) < fVar289) &&
                   (ABS(fVar230) < local_3f8 * 1.9073486e-06 + fVar183 + fVar289)) {
                  fVar169 = local_2f8._0_4_ + fVar169;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar169) &&
                     (((fVar124 = (ray->super_RayK<1>).tfar, fVar169 <= fVar124 && (0.0 <= fVar167))
                      && (fVar167 <= 1.0)))) {
                    auVar27._4_4_ = fStack_3a4;
                    auVar27._0_4_ = local_3a8;
                    auVar27._8_4_ = fStack_3a0;
                    auVar27._12_4_ = fStack_39c;
                    auVar82 = rsqrtss(auVar27,auVar27);
                    fVar126 = auVar82._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)pRVar69].ptr;
                    uVar78 = (ray->super_RayK<1>).mask;
                    pRVar64 = (RayHit *)(ulong)uVar78;
                    pRVar68 = pRVar69;
                    if ((pGVar19->mask & uVar78) != 0) {
                      fVar126 = fVar126 * 1.5 + fVar126 * fVar126 * local_3a8 * -0.5 * fVar126;
                      fVar204 = fVar204 * fVar126;
                      fVar231 = fVar231 * fVar126;
                      fVar232 = fVar232 * fVar126;
                      fVar126 = fVar265 * fVar204 + fVar242;
                      fVar129 = fVar265 * fVar231 + fVar253;
                      fVar156 = fVar265 * fVar232 + fVar254;
                      fVar184 = fVar231 * fVar242 - fVar253 * fVar204;
                      fVar185 = fVar232 * fVar253 - fVar254 * fVar231;
                      fVar203 = fVar204 * fVar254 - fVar242 * fVar232;
                      fVar183 = fVar129 * fVar185 - fVar203 * fVar126;
                      fVar129 = fVar156 * fVar203 - fVar184 * fVar129;
                      fVar126 = fVar126 * fVar184 - fVar185 * fVar156;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar169;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar126,fVar129);
                        (ray->Ng).field_0.field_0.z = fVar183;
                        ray->u = fVar167;
                        ray->v = 0.0;
                        ray->primID = uVar77;
                        ray->geomID = uVar76;
                        ray->instID[0] = context->user->instID[0];
                        uVar78 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar78;
                        pRVar64 = (RayHit *)(ulong)uVar78;
                      }
                      else {
                        local_468 = CONCAT44(fVar126,fVar129);
                        fStack_460 = fVar183;
                        fStack_45c = fVar167;
                        local_458 = 0;
                        local_454 = uVar77;
                        local_450 = uVar76;
                        local_44c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_44c;
                        local_448 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar169;
                        local_4ac = 0xffffffff;
                        local_508.geometryUserPtr = pGVar19->userPtr;
                        local_508.valid = &local_4ac;
                        local_508.context = context->user;
                        local_508.hit = (RTCHitN *)&local_468;
                        local_508.N = 1;
                        local_508.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b3a798:
                          pRVar68 = context->args;
                          if ((pRVar68->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar68->filter)(&local_508);
                            if ((((RayK<1> *)local_508.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b3a841;
                          }
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_508.hit;
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_508.hit + 4);
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_508.hit + 8);
                          *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                          *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                          *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                          *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                          *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_508.hit + 0x20);
                          *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                          pRVar64 = (RayHit *)local_508.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_508);
                          if ((((RayK<1> *)local_508.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b3a798;
LAB_00b3a841:
                          (ray->super_RayK<1>).tfar = fVar124;
                          pRVar64 = (RayHit *)local_508.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              uVar62 = SUB84(pRVar68,0);
              fVar183 = (ray->super_RayK<1>).tfar;
              local_378._0_4_ = -(uint)(local_418 <= fVar183) & local_378._0_4_;
              local_378._4_4_ = -(uint)(fStack_414 <= fVar183) & local_378._4_4_;
              local_378._8_4_ = -(uint)(fStack_410 <= fVar183) & local_378._8_4_;
              local_378._12_4_ = -(uint)(fStack_40c <= fVar183) & local_378._12_4_;
              uVar67 = (undefined4)((ulong)pRVar64 >> 0x20);
              iVar61 = movmskps((int)pRVar64,local_378);
              fVar185 = (float)local_408._0_4_;
              fVar203 = (float)local_408._4_4_;
              fVar204 = fStack_400;
              fVar205 = fStack_3fc;
            } while (iVar61 != 0);
            iVar61 = 0;
            fVar185 = (float)local_1f8._0_4_;
            fVar203 = (float)local_1f8._4_4_;
            fVar204 = fStack_1f0;
            fVar205 = fStack_1ec;
          }
          auVar202._0_4_ =
               local_498._0_4_ & local_308._0_4_ &
               -(uint)(local_488 + (float)local_138._0_4_ <= fVar183);
          auVar202._4_4_ =
               local_498._4_4_ & local_308._4_4_ &
               -(uint)(fStack_484 + (float)local_138._4_4_ <= fVar183);
          auVar202._8_4_ =
               (uint)fStack_490 & (uint)fStack_300 & -(uint)(fStack_480 + fStack_130 <= fVar183);
          auVar202._12_4_ =
               (uint)fStack_48c & (uint)fStack_2fc & -(uint)(fStack_47c + fStack_12c <= fVar183);
          auVar119._0_4_ =
               auVar149._0_4_ & local_4a8._0_4_ & -(uint)(local_488 + fVar185 <= fVar183);
          auVar119._4_4_ =
               auVar149._4_4_ & local_4a8._4_4_ & -(uint)(fStack_484 + fVar203 <= fVar183);
          auVar119._8_4_ =
               auVar149._8_4_ & (uint)fStack_4a0 & -(uint)(fStack_480 + fVar204 <= fVar183);
          auVar119._12_4_ =
               auVar149._12_4_ & (uint)fStack_49c & -(uint)(fStack_47c + fVar205 <= fVar183);
          iVar61 = movmskps(iVar61,auVar119 | auVar202);
          auVar248 = _local_4c8;
          if (iVar61 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar71 * 0x30) = auVar119 | auVar202;
            auStack_e8[uVar71 * 0xc] =
                 ~auVar202._0_4_ & (uint)fVar185 | local_138._0_4_ & auVar202._0_4_;
            auStack_e8[uVar71 * 0xc + 1] =
                 ~auVar202._4_4_ & (uint)fVar203 | local_138._4_4_ & auVar202._4_4_;
            auStack_e8[uVar71 * 0xc + 2] =
                 ~auVar202._8_4_ & (uint)fVar204 | (uint)fStack_130 & auVar202._8_4_;
            auStack_e8[uVar71 * 0xc + 3] =
                 ~auVar202._12_4_ & (uint)fVar205 | (uint)fStack_12c & auVar202._12_4_;
            (&uStack_d8)[uVar71 * 6] = CONCAT44(fStack_184,local_188);
            aiStack_d0[uVar71 * 0xc] = (int)fVar168 + 1;
            iVar70 = iVar70 + 1;
          }
        }
      }
    }
    _local_4c8 = auVar248;
    fVar168 = (ray->super_RayK<1>).tfar;
    if (iVar70 == 0) break;
    uVar81 = -iVar70;
    pauVar65 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar70 - 1) * 0x30);
    uVar78 = uVar81;
    while( true ) {
      local_508.valid._0_4_ =
           -(uint)(local_488 + *(float *)pauVar65[1] <= fVar168) & *(uint *)*pauVar65;
      local_508.valid._4_4_ =
           -(uint)(fStack_484 + *(float *)(pauVar65[1] + 4) <= fVar168) & *(uint *)(*pauVar65 + 4);
      local_508.geometryUserPtr._0_4_ =
           -(uint)(fStack_480 + *(float *)(pauVar65[1] + 8) <= fVar168) & *(uint *)(*pauVar65 + 8);
      local_508.geometryUserPtr._4_4_ =
           -(uint)(fStack_47c + *(float *)(pauVar65[1] + 0xc) <= fVar168) &
           *(uint *)(*pauVar65 + 0xc);
      iVar61 = movmskps(uVar78,(undefined1  [16])local_508._0_16_);
      if (iVar61 != 0) break;
      pauVar65 = pauVar65 + -3;
      uVar81 = uVar81 + 1;
      uVar78 = 0;
      if (uVar81 == 0) {
        uVar62 = 0;
        goto LAB_00b3aa80;
      }
    }
    auVar165._0_4_ = (uint)*(float *)pauVar65[1] & (uint)local_508.valid;
    auVar165._4_4_ = (uint)*(float *)(pauVar65[1] + 4) & local_508.valid._4_4_;
    auVar165._8_4_ = (uint)*(float *)(pauVar65[1] + 8) & (uint)local_508.geometryUserPtr;
    auVar165._12_4_ = (uint)*(float *)(pauVar65[1] + 0xc) & local_508.geometryUserPtr._4_4_;
    auVar182._0_8_ = CONCAT44(~local_508.valid._4_4_,~(uint)local_508.valid) & 0x7f8000007f800000;
    auVar182._8_4_ = ~(uint)local_508.geometryUserPtr & 0x7f800000;
    auVar182._12_4_ = ~local_508.geometryUserPtr._4_4_ & 0x7f800000;
    auVar182 = auVar182 | auVar165;
    auVar166._4_4_ = auVar182._0_4_;
    auVar166._0_4_ = auVar182._4_4_;
    auVar166._8_4_ = auVar182._12_4_;
    auVar166._12_4_ = auVar182._8_4_;
    auVar82 = minps(auVar166,auVar182);
    auVar120._0_8_ = auVar82._8_8_;
    auVar120._8_4_ = auVar82._0_4_;
    auVar120._12_4_ = auVar82._4_4_;
    auVar82 = minps(auVar120,auVar82);
    auVar121._0_8_ =
         CONCAT44(-(uint)(auVar82._4_4_ == auVar182._4_4_) & local_508.valid._4_4_,
                  -(uint)(auVar82._0_4_ == auVar182._0_4_) & (uint)local_508.valid);
    auVar121._8_4_ = -(uint)(auVar82._8_4_ == auVar182._8_4_) & (uint)local_508.geometryUserPtr;
    auVar121._12_4_ = -(uint)(auVar82._12_4_ == auVar182._12_4_) & local_508.geometryUserPtr._4_4_;
    iVar61 = movmskps(iVar61,auVar121);
    auVar152 = (undefined1  [16])local_508._0_16_;
    if (iVar61 != 0) {
      auVar152._8_4_ = auVar121._8_4_;
      auVar152._0_8_ = auVar121._0_8_;
      auVar152._12_4_ = auVar121._12_4_;
    }
    uVar293 = *(undefined8 *)pauVar65[2];
    fVar168 = *(float *)(pauVar65[2] + 8);
    uVar78 = movmskps(iVar61,auVar152);
    pRVar68 = (RTCIntersectArguments *)0x0;
    if (uVar78 != 0) {
      for (; (uVar78 >> (long)pRVar68 & 1) == 0;
          pRVar68 = (RTCIntersectArguments *)((long)&pRVar68->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&local_508.valid + (long)pRVar68 * 4) = 0;
    *pauVar65 = (undefined1  [16])local_508._0_16_;
    iVar61 = movmskps((int)pauVar65,(undefined1  [16])local_508._0_16_);
    lVar66 = CONCAT44((int)((ulong)pauVar65 >> 0x20),iVar61);
    uVar78 = ~uVar81;
    if (iVar61 != 0) {
      uVar78 = -uVar81;
    }
    uVar71 = (ulong)uVar78;
    fVar124 = (float)uVar293;
    fVar126 = (float)((ulong)uVar293 >> 0x20) - fVar124;
    local_468 = CONCAT44(fVar126 * 0.33333334 + fVar124,fVar126 * 0.0 + fVar124);
    fStack_460 = fVar126 * 0.6666667 + fVar124;
    fStack_45c = fVar126 * 1.0 + fVar124;
    local_188 = *(float *)((long)&local_468 + (long)pRVar68 * 4);
    fStack_184 = *(float *)((long)&local_468 + (long)pRVar68 * 4 + 4);
  } while( true );
LAB_00b3aa80:
  auVar153._4_4_ = -(uint)(fStack_1d4 <= fVar168);
  auVar153._0_4_ = -(uint)(local_1d8 <= fVar168);
  auVar153._8_4_ = -(uint)(fStack_1d0 <= fVar168);
  auVar153._12_4_ = -(uint)(fStack_1cc <= fVar168);
  uVar76 = movmskps(uVar62,auVar153);
  uVar75 = uVar75 - 1 & uVar75 & uVar76;
  if (uVar75 == 0) {
    return;
  }
  goto LAB_00b3811c;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }